

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O0

void highbd_set_var_fns(AV1_PRIMARY *ppi)

{
  aom_bit_depth_t aVar1;
  SequenceHeader *seq_params;
  AV1_PRIMARY *ppi_local;
  
  if ((ppi->seq_params).use_highbitdepth != '\0') {
    aVar1 = (ppi->seq_params).bit_depth;
    if (aVar1 == AOM_BITS_8) {
      ppi->fn_ptr[0x15].sdf = aom_highbd_sad64x16_bits8;
      ppi->fn_ptr[0x15].sdaf = aom_highbd_sad64x16_avg_bits8;
      ppi->fn_ptr[0x15].vf = aom_highbd_8_variance64x16_sse2;
      ppi->fn_ptr[0x15].svf = aom_highbd_8_sub_pixel_variance64x16_sse2;
      ppi->fn_ptr[0x15].svaf = aom_highbd_8_sub_pixel_avg_variance64x16_sse2;
      ppi->fn_ptr[0x15].sdx4df = aom_highbd_sad64x16x4d_bits8;
      ppi->fn_ptr[0x15].sdx3df = aom_highbd_sad64x16x3d_bits8;
      ppi->fn_ptr[0x14].sdf = aom_highbd_sad16x64_bits8;
      ppi->fn_ptr[0x14].sdaf = aom_highbd_sad16x64_avg_bits8;
      ppi->fn_ptr[0x14].vf = aom_highbd_8_variance16x64_sse2;
      ppi->fn_ptr[0x14].svf = aom_highbd_8_sub_pixel_variance16x64_sse2;
      ppi->fn_ptr[0x14].svaf = aom_highbd_8_sub_pixel_avg_variance16x64_sse2;
      ppi->fn_ptr[0x14].sdx4df = aom_highbd_sad16x64x4d_bits8;
      ppi->fn_ptr[0x14].sdx3df = aom_highbd_sad16x64x3d_bits8;
      ppi->fn_ptr[0x13].sdf = aom_highbd_sad32x8_bits8;
      ppi->fn_ptr[0x13].sdaf = aom_highbd_sad32x8_avg_bits8;
      ppi->fn_ptr[0x13].vf = aom_highbd_8_variance32x8_sse2;
      ppi->fn_ptr[0x13].svf = aom_highbd_8_sub_pixel_variance32x8_sse2;
      ppi->fn_ptr[0x13].svaf = aom_highbd_8_sub_pixel_avg_variance32x8_sse2;
      ppi->fn_ptr[0x13].sdx4df = aom_highbd_sad32x8x4d_bits8;
      ppi->fn_ptr[0x13].sdx3df = aom_highbd_sad32x8x3d_bits8;
      ppi->fn_ptr[0x12].sdf = aom_highbd_sad8x32_bits8;
      ppi->fn_ptr[0x12].sdaf = aom_highbd_sad8x32_avg_bits8;
      ppi->fn_ptr[0x12].vf = aom_highbd_8_variance8x32_sse2;
      ppi->fn_ptr[0x12].svf = aom_highbd_8_sub_pixel_variance8x32_sse2;
      ppi->fn_ptr[0x12].svaf = aom_highbd_8_sub_pixel_avg_variance8x32_sse2;
      ppi->fn_ptr[0x12].sdx4df = aom_highbd_sad8x32x4d_bits8;
      ppi->fn_ptr[0x12].sdx3df = aom_highbd_sad8x32x3d_bits8;
      ppi->fn_ptr[0x11].sdf = aom_highbd_sad16x4_bits8;
      ppi->fn_ptr[0x11].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0x11].vf = aom_highbd_8_variance16x4_c;
      ppi->fn_ptr[0x11].svf = aom_highbd_8_sub_pixel_variance16x4_sse2;
      ppi->fn_ptr[0x11].svaf = aom_highbd_8_sub_pixel_avg_variance16x4_sse2;
      ppi->fn_ptr[0x11].sdx4df = aom_highbd_sad16x4x4d_bits8;
      ppi->fn_ptr[0x11].sdx3df = aom_highbd_sad16x4x3d_bits8;
      ppi->fn_ptr[0x10].sdf = aom_highbd_sad4x16_bits8;
      ppi->fn_ptr[0x10].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0x10].vf = aom_highbd_8_variance4x16_c;
      ppi->fn_ptr[0x10].svf = aom_highbd_8_sub_pixel_variance4x16_c;
      ppi->fn_ptr[0x10].svaf = aom_highbd_8_sub_pixel_avg_variance4x16_c;
      ppi->fn_ptr[0x10].sdx4df = aom_highbd_sad4x16x4d_bits8;
      ppi->fn_ptr[0x10].sdx3df = aom_highbd_sad4x16x3d_bits8;
      ppi->fn_ptr[8].sdf = aom_highbd_sad32x16_bits8;
      ppi->fn_ptr[8].sdaf = aom_highbd_sad32x16_avg_bits8;
      ppi->fn_ptr[8].vf = aom_highbd_8_variance32x16_sse2;
      ppi->fn_ptr[8].svf = aom_highbd_8_sub_pixel_variance32x16_sse2;
      ppi->fn_ptr[8].svaf = aom_highbd_8_sub_pixel_avg_variance32x16_sse2;
      ppi->fn_ptr[8].sdx4df = aom_highbd_sad32x16x4d_bits8;
      ppi->fn_ptr[8].sdx3df = aom_highbd_sad32x16x3d_bits8;
      ppi->fn_ptr[7].sdf = aom_highbd_sad16x32_bits8;
      ppi->fn_ptr[7].sdaf = aom_highbd_sad16x32_avg_bits8;
      ppi->fn_ptr[7].vf = aom_highbd_8_variance16x32_sse2;
      ppi->fn_ptr[7].svf = aom_highbd_8_sub_pixel_variance16x32_sse2;
      ppi->fn_ptr[7].svaf = aom_highbd_8_sub_pixel_avg_variance16x32_sse2;
      ppi->fn_ptr[7].sdx4df = aom_highbd_sad16x32x4d_bits8;
      ppi->fn_ptr[7].sdx3df = aom_highbd_sad16x32x3d_bits8;
      ppi->fn_ptr[0xb].sdf = aom_highbd_sad64x32_bits8;
      ppi->fn_ptr[0xb].sdaf = aom_highbd_sad64x32_avg_bits8;
      ppi->fn_ptr[0xb].vf = aom_highbd_8_variance64x32_sse2;
      ppi->fn_ptr[0xb].svf = aom_highbd_8_sub_pixel_variance64x32_sse2;
      ppi->fn_ptr[0xb].svaf = aom_highbd_8_sub_pixel_avg_variance64x32_sse2;
      ppi->fn_ptr[0xb].sdx4df = aom_highbd_sad64x32x4d_bits8;
      ppi->fn_ptr[0xb].sdx3df = aom_highbd_sad64x32x3d_bits8;
      ppi->fn_ptr[10].sdf = aom_highbd_sad32x64_bits8;
      ppi->fn_ptr[10].sdaf = aom_highbd_sad32x64_avg_bits8;
      ppi->fn_ptr[10].vf = aom_highbd_8_variance32x64_sse2;
      ppi->fn_ptr[10].svf = aom_highbd_8_sub_pixel_variance32x64_sse2;
      ppi->fn_ptr[10].svaf = aom_highbd_8_sub_pixel_avg_variance32x64_sse2;
      ppi->fn_ptr[10].sdx4df = aom_highbd_sad32x64x4d_bits8;
      ppi->fn_ptr[10].sdx3df = aom_highbd_sad32x64x3d_bits8;
      ppi->fn_ptr[9].sdf = aom_highbd_sad32x32_bits8;
      ppi->fn_ptr[9].sdaf = aom_highbd_sad32x32_avg_bits8;
      ppi->fn_ptr[9].vf = aom_highbd_8_variance32x32_sse2;
      ppi->fn_ptr[9].svf = aom_highbd_8_sub_pixel_variance32x32_sse2;
      ppi->fn_ptr[9].svaf = aom_highbd_8_sub_pixel_avg_variance32x32_sse2;
      ppi->fn_ptr[9].sdx4df = aom_highbd_sad32x32x4d_bits8;
      ppi->fn_ptr[9].sdx3df = aom_highbd_sad32x32x3d_bits8;
      ppi->fn_ptr[0xc].sdf = aom_highbd_sad64x64_bits8;
      ppi->fn_ptr[0xc].sdaf = aom_highbd_sad64x64_avg_bits8;
      ppi->fn_ptr[0xc].vf = aom_highbd_8_variance64x64_sse2;
      ppi->fn_ptr[0xc].svf = aom_highbd_8_sub_pixel_variance64x64_sse2;
      ppi->fn_ptr[0xc].svaf = aom_highbd_8_sub_pixel_avg_variance64x64_sse2;
      ppi->fn_ptr[0xc].sdx4df = aom_highbd_sad64x64x4d_bits8;
      ppi->fn_ptr[0xc].sdx3df = aom_highbd_sad64x64x3d_bits8;
      ppi->fn_ptr[6].sdf = aom_highbd_sad16x16_bits8;
      ppi->fn_ptr[6].sdaf = aom_highbd_sad16x16_avg_bits8;
      ppi->fn_ptr[6].vf = aom_highbd_8_variance16x16_sse2;
      ppi->fn_ptr[6].svf = aom_highbd_8_sub_pixel_variance16x16_sse2;
      ppi->fn_ptr[6].svaf = aom_highbd_8_sub_pixel_avg_variance16x16_sse2;
      ppi->fn_ptr[6].sdx4df = aom_highbd_sad16x16x4d_bits8;
      ppi->fn_ptr[6].sdx3df = aom_highbd_sad16x16x3d_bits8;
      ppi->fn_ptr[5].sdf = aom_highbd_sad16x8_bits8;
      ppi->fn_ptr[5].sdaf = aom_highbd_sad16x8_avg_bits8;
      ppi->fn_ptr[5].vf = aom_highbd_8_variance16x8_sse2;
      ppi->fn_ptr[5].svf = aom_highbd_8_sub_pixel_variance16x8_sse2;
      ppi->fn_ptr[5].svaf = aom_highbd_8_sub_pixel_avg_variance16x8_sse2;
      ppi->fn_ptr[5].sdx4df = aom_highbd_sad16x8x4d_bits8;
      ppi->fn_ptr[5].sdx3df = aom_highbd_sad16x8x3d_bits8;
      ppi->fn_ptr[4].sdf = aom_highbd_sad8x16_bits8;
      ppi->fn_ptr[4].sdaf = aom_highbd_sad8x16_avg_bits8;
      ppi->fn_ptr[4].vf = aom_highbd_8_variance8x16_sse2;
      ppi->fn_ptr[4].svf = aom_highbd_8_sub_pixel_variance8x16_sse2;
      ppi->fn_ptr[4].svaf = aom_highbd_8_sub_pixel_avg_variance8x16_sse2;
      ppi->fn_ptr[4].sdx4df = aom_highbd_sad8x16x4d_bits8;
      ppi->fn_ptr[4].sdx3df = aom_highbd_sad8x16x3d_bits8;
      ppi->fn_ptr[3].sdf = aom_highbd_sad8x8_bits8;
      ppi->fn_ptr[3].sdaf = aom_highbd_sad8x8_avg_bits8;
      ppi->fn_ptr[3].vf = aom_highbd_8_variance8x8_sse2;
      ppi->fn_ptr[3].svf = aom_highbd_8_sub_pixel_variance8x8_sse2;
      ppi->fn_ptr[3].svaf = aom_highbd_8_sub_pixel_avg_variance8x8_sse2;
      ppi->fn_ptr[3].sdx4df = aom_highbd_sad8x8x4d_bits8;
      ppi->fn_ptr[3].sdx3df = aom_highbd_sad8x8x3d_bits8;
      ppi->fn_ptr[2].sdf = aom_highbd_sad8x4_bits8;
      ppi->fn_ptr[2].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[2].vf = aom_highbd_8_variance8x4_c;
      ppi->fn_ptr[2].svf = aom_highbd_8_sub_pixel_variance8x4_sse2;
      ppi->fn_ptr[2].svaf = aom_highbd_8_sub_pixel_avg_variance8x4_sse2;
      ppi->fn_ptr[2].sdx4df = aom_highbd_sad8x4x4d_bits8;
      ppi->fn_ptr[2].sdx3df = aom_highbd_sad8x4x3d_bits8;
      ppi->fn_ptr[1].sdf = aom_highbd_sad4x8_bits8;
      ppi->fn_ptr[1].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[1].vf = aom_highbd_8_variance4x8_c;
      ppi->fn_ptr[1].svf = aom_highbd_8_sub_pixel_variance4x8_c;
      ppi->fn_ptr[1].svaf = aom_highbd_8_sub_pixel_avg_variance4x8_c;
      ppi->fn_ptr[1].sdx4df = aom_highbd_sad4x8x4d_bits8;
      ppi->fn_ptr[1].sdx3df = aom_highbd_sad4x8x3d_bits8;
      ppi->fn_ptr[0].sdf = aom_highbd_sad4x4_bits8;
      ppi->fn_ptr[0].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0].vf = (aom_variance_fn_t)aom_highbd_8_variance4x4;
      ppi->fn_ptr[0].svf = (aom_subpixvariance_fn_t)aom_highbd_8_sub_pixel_variance4x4;
      ppi->fn_ptr[0].svaf = (aom_subp_avg_variance_fn_t)aom_highbd_8_sub_pixel_avg_variance4x4;
      ppi->fn_ptr[0].sdx4df = aom_highbd_sad4x4x4d_bits8;
      ppi->fn_ptr[0].sdx3df = aom_highbd_sad4x4x3d_bits8;
      ppi->fn_ptr[0xf].sdf = aom_highbd_sad128x128_bits8;
      ppi->fn_ptr[0xf].sdaf = aom_highbd_sad128x128_avg_bits8;
      ppi->fn_ptr[0xf].vf = aom_highbd_8_variance128x128_sse2;
      ppi->fn_ptr[0xf].svf = aom_highbd_8_sub_pixel_variance128x128_sse2;
      ppi->fn_ptr[0xf].svaf = aom_highbd_8_sub_pixel_avg_variance128x128_c;
      ppi->fn_ptr[0xf].sdx4df = aom_highbd_sad128x128x4d_bits8;
      ppi->fn_ptr[0xf].sdx3df = aom_highbd_sad128x128x3d_bits8;
      ppi->fn_ptr[0xe].sdf = aom_highbd_sad128x64_bits8;
      ppi->fn_ptr[0xe].sdaf = aom_highbd_sad128x64_avg_bits8;
      ppi->fn_ptr[0xe].vf = aom_highbd_8_variance128x64_sse2;
      ppi->fn_ptr[0xe].svf = aom_highbd_8_sub_pixel_variance128x64_sse2;
      ppi->fn_ptr[0xe].svaf = aom_highbd_8_sub_pixel_avg_variance128x64_c;
      ppi->fn_ptr[0xe].sdx4df = aom_highbd_sad128x64x4d_bits8;
      ppi->fn_ptr[0xe].sdx3df = aom_highbd_sad128x64x3d_bits8;
      ppi->fn_ptr[0xd].sdf = aom_highbd_sad64x128_bits8;
      ppi->fn_ptr[0xd].sdaf = aom_highbd_sad64x128_avg_bits8;
      ppi->fn_ptr[0xd].vf = aom_highbd_8_variance64x128_sse2;
      ppi->fn_ptr[0xd].svf = aom_highbd_8_sub_pixel_variance64x128_sse2;
      ppi->fn_ptr[0xd].svaf = aom_highbd_8_sub_pixel_avg_variance64x128_c;
      ppi->fn_ptr[0xd].sdx4df = aom_highbd_sad64x128x4d_bits8;
      ppi->fn_ptr[0xd].sdx3df = aom_highbd_sad64x128x3d_bits8;
      ppi->fn_ptr[0xf].msdf = aom_highbd_masked_sad128x128_bits8;
      ppi->fn_ptr[0xf].msvf = aom_highbd_8_masked_sub_pixel_variance128x128;
      ppi->fn_ptr[0xe].msdf = aom_highbd_masked_sad128x64_bits8;
      ppi->fn_ptr[0xe].msvf = aom_highbd_8_masked_sub_pixel_variance128x64;
      ppi->fn_ptr[0xd].msdf = aom_highbd_masked_sad64x128_bits8;
      ppi->fn_ptr[0xd].msvf = aom_highbd_8_masked_sub_pixel_variance64x128;
      ppi->fn_ptr[0xc].msdf = aom_highbd_masked_sad64x64_bits8;
      ppi->fn_ptr[0xc].msvf = aom_highbd_8_masked_sub_pixel_variance64x64;
      ppi->fn_ptr[0xb].msdf = aom_highbd_masked_sad64x32_bits8;
      ppi->fn_ptr[0xb].msvf = aom_highbd_8_masked_sub_pixel_variance64x32;
      ppi->fn_ptr[10].msdf = aom_highbd_masked_sad32x64_bits8;
      ppi->fn_ptr[10].msvf = aom_highbd_8_masked_sub_pixel_variance32x64;
      ppi->fn_ptr[9].msdf = aom_highbd_masked_sad32x32_bits8;
      ppi->fn_ptr[9].msvf = aom_highbd_8_masked_sub_pixel_variance32x32;
      ppi->fn_ptr[8].msdf = aom_highbd_masked_sad32x16_bits8;
      ppi->fn_ptr[8].msvf = aom_highbd_8_masked_sub_pixel_variance32x16;
      ppi->fn_ptr[7].msdf = aom_highbd_masked_sad16x32_bits8;
      ppi->fn_ptr[7].msvf = aom_highbd_8_masked_sub_pixel_variance16x32;
      ppi->fn_ptr[6].msdf = aom_highbd_masked_sad16x16_bits8;
      ppi->fn_ptr[6].msvf = aom_highbd_8_masked_sub_pixel_variance16x16;
      ppi->fn_ptr[4].msdf = aom_highbd_masked_sad8x16_bits8;
      ppi->fn_ptr[4].msvf = aom_highbd_8_masked_sub_pixel_variance8x16;
      ppi->fn_ptr[5].msdf = aom_highbd_masked_sad16x8_bits8;
      ppi->fn_ptr[5].msvf = aom_highbd_8_masked_sub_pixel_variance16x8;
      ppi->fn_ptr[3].msdf = aom_highbd_masked_sad8x8_bits8;
      ppi->fn_ptr[3].msvf = aom_highbd_8_masked_sub_pixel_variance8x8;
      ppi->fn_ptr[1].msdf = aom_highbd_masked_sad4x8_bits8;
      ppi->fn_ptr[1].msvf = aom_highbd_8_masked_sub_pixel_variance4x8;
      ppi->fn_ptr[2].msdf = aom_highbd_masked_sad8x4_bits8;
      ppi->fn_ptr[2].msvf = aom_highbd_8_masked_sub_pixel_variance8x4;
      ppi->fn_ptr[0].msdf = aom_highbd_masked_sad4x4_bits8;
      ppi->fn_ptr[0].msvf = aom_highbd_8_masked_sub_pixel_variance4x4;
      ppi->fn_ptr[0x15].msdf = aom_highbd_masked_sad64x16_bits8;
      ppi->fn_ptr[0x15].msvf = aom_highbd_8_masked_sub_pixel_variance64x16;
      ppi->fn_ptr[0x14].msdf = aom_highbd_masked_sad16x64_bits8;
      ppi->fn_ptr[0x14].msvf = aom_highbd_8_masked_sub_pixel_variance16x64;
      ppi->fn_ptr[0x13].msdf = aom_highbd_masked_sad32x8_bits8;
      ppi->fn_ptr[0x13].msvf = aom_highbd_8_masked_sub_pixel_variance32x8;
      ppi->fn_ptr[0x12].msdf = aom_highbd_masked_sad8x32_bits8;
      ppi->fn_ptr[0x12].msvf = aom_highbd_8_masked_sub_pixel_variance8x32;
      ppi->fn_ptr[0x11].msdf = aom_highbd_masked_sad16x4_bits8;
      ppi->fn_ptr[0x11].msvf = aom_highbd_8_masked_sub_pixel_variance16x4;
      ppi->fn_ptr[0x10].msdf = aom_highbd_masked_sad4x16_bits8;
      ppi->fn_ptr[0x10].msvf = aom_highbd_8_masked_sub_pixel_variance4x16;
      ppi->fn_ptr[0xf].osdf = aom_highbd_obmc_sad128x128_bits8;
      ppi->fn_ptr[0xf].ovf = aom_highbd_8_obmc_variance128x128;
      ppi->fn_ptr[0xf].osvf = aom_highbd_8_obmc_sub_pixel_variance128x128_c;
      ppi->fn_ptr[0xe].osdf = aom_highbd_obmc_sad128x64_bits8;
      ppi->fn_ptr[0xe].ovf = aom_highbd_8_obmc_variance128x64;
      ppi->fn_ptr[0xe].osvf = aom_highbd_8_obmc_sub_pixel_variance128x64_c;
      ppi->fn_ptr[0xd].osdf = aom_highbd_obmc_sad64x128_bits8;
      ppi->fn_ptr[0xd].ovf = aom_highbd_8_obmc_variance64x128;
      ppi->fn_ptr[0xd].osvf = aom_highbd_8_obmc_sub_pixel_variance64x128_c;
      ppi->fn_ptr[0xc].osdf = aom_highbd_obmc_sad64x64_bits8;
      ppi->fn_ptr[0xc].ovf = aom_highbd_8_obmc_variance64x64;
      ppi->fn_ptr[0xc].osvf = aom_highbd_8_obmc_sub_pixel_variance64x64_c;
      ppi->fn_ptr[0xb].osdf = aom_highbd_obmc_sad64x32_bits8;
      ppi->fn_ptr[0xb].ovf = aom_highbd_8_obmc_variance64x32;
      ppi->fn_ptr[0xb].osvf = aom_highbd_8_obmc_sub_pixel_variance64x32_c;
      ppi->fn_ptr[10].osdf = aom_highbd_obmc_sad32x64_bits8;
      ppi->fn_ptr[10].ovf = aom_highbd_8_obmc_variance32x64;
      ppi->fn_ptr[10].osvf = aom_highbd_8_obmc_sub_pixel_variance32x64_c;
      ppi->fn_ptr[9].osdf = aom_highbd_obmc_sad32x32_bits8;
      ppi->fn_ptr[9].ovf = aom_highbd_8_obmc_variance32x32;
      ppi->fn_ptr[9].osvf = aom_highbd_8_obmc_sub_pixel_variance32x32_c;
      ppi->fn_ptr[8].osdf = aom_highbd_obmc_sad32x16_bits8;
      ppi->fn_ptr[8].ovf = aom_highbd_8_obmc_variance32x16;
      ppi->fn_ptr[8].osvf = aom_highbd_8_obmc_sub_pixel_variance32x16_c;
      ppi->fn_ptr[7].osdf = aom_highbd_obmc_sad16x32_bits8;
      ppi->fn_ptr[7].ovf = aom_highbd_8_obmc_variance16x32;
      ppi->fn_ptr[7].osvf = aom_highbd_8_obmc_sub_pixel_variance16x32_c;
      ppi->fn_ptr[6].osdf = aom_highbd_obmc_sad16x16_bits8;
      ppi->fn_ptr[6].ovf = aom_highbd_8_obmc_variance16x16;
      ppi->fn_ptr[6].osvf = aom_highbd_8_obmc_sub_pixel_variance16x16_c;
      ppi->fn_ptr[4].osdf = aom_highbd_obmc_sad8x16_bits8;
      ppi->fn_ptr[4].ovf = aom_highbd_8_obmc_variance8x16;
      ppi->fn_ptr[4].osvf = aom_highbd_8_obmc_sub_pixel_variance8x16_c;
      ppi->fn_ptr[5].osdf = aom_highbd_obmc_sad16x8_bits8;
      ppi->fn_ptr[5].ovf = aom_highbd_8_obmc_variance16x8;
      ppi->fn_ptr[5].osvf = aom_highbd_8_obmc_sub_pixel_variance16x8_c;
      ppi->fn_ptr[3].osdf = aom_highbd_obmc_sad8x8_bits8;
      ppi->fn_ptr[3].ovf = aom_highbd_8_obmc_variance8x8;
      ppi->fn_ptr[3].osvf = aom_highbd_8_obmc_sub_pixel_variance8x8_c;
      ppi->fn_ptr[1].osdf = aom_highbd_obmc_sad4x8_bits8;
      ppi->fn_ptr[1].ovf = aom_highbd_8_obmc_variance4x8;
      ppi->fn_ptr[1].osvf = aom_highbd_8_obmc_sub_pixel_variance4x8_c;
      ppi->fn_ptr[2].osdf = aom_highbd_obmc_sad8x4_bits8;
      ppi->fn_ptr[2].ovf = aom_highbd_8_obmc_variance8x4;
      ppi->fn_ptr[2].osvf = aom_highbd_8_obmc_sub_pixel_variance8x4_c;
      ppi->fn_ptr[0].osdf = aom_highbd_obmc_sad4x4_bits8;
      ppi->fn_ptr[0].ovf = aom_highbd_8_obmc_variance4x4;
      ppi->fn_ptr[0].osvf = aom_highbd_8_obmc_sub_pixel_variance4x4_c;
      ppi->fn_ptr[0x15].osdf = aom_highbd_obmc_sad64x16_bits8;
      ppi->fn_ptr[0x15].ovf = aom_highbd_8_obmc_variance64x16;
      ppi->fn_ptr[0x15].osvf = aom_highbd_8_obmc_sub_pixel_variance64x16_c;
      ppi->fn_ptr[0x14].osdf = aom_highbd_obmc_sad16x64_bits8;
      ppi->fn_ptr[0x14].ovf = aom_highbd_8_obmc_variance16x64;
      ppi->fn_ptr[0x14].osvf = aom_highbd_8_obmc_sub_pixel_variance16x64_c;
      ppi->fn_ptr[0x13].osdf = aom_highbd_obmc_sad32x8_bits8;
      ppi->fn_ptr[0x13].ovf = aom_highbd_8_obmc_variance32x8;
      ppi->fn_ptr[0x13].osvf = aom_highbd_8_obmc_sub_pixel_variance32x8_c;
      ppi->fn_ptr[0x12].osdf = aom_highbd_obmc_sad8x32_bits8;
      ppi->fn_ptr[0x12].ovf = aom_highbd_8_obmc_variance8x32;
      ppi->fn_ptr[0x12].osvf = aom_highbd_8_obmc_sub_pixel_variance8x32_c;
      ppi->fn_ptr[0x11].osdf = aom_highbd_obmc_sad16x4_bits8;
      ppi->fn_ptr[0x11].ovf = aom_highbd_8_obmc_variance16x4;
      ppi->fn_ptr[0x11].osvf = aom_highbd_8_obmc_sub_pixel_variance16x4_c;
      ppi->fn_ptr[0x10].osdf = aom_highbd_obmc_sad4x16_bits8;
      ppi->fn_ptr[0x10].ovf = aom_highbd_8_obmc_variance4x16;
      ppi->fn_ptr[0x10].osvf = aom_highbd_8_obmc_sub_pixel_variance4x16_c;
      ppi->fn_ptr[0xf].sdsf = aom_highbd_sad_skip_128x128_bits8;
      ppi->fn_ptr[0xf].sdsx4df = aom_highbd_sad_skip_128x128x4d_bits8;
      ppi->fn_ptr[0xe].sdsf = aom_highbd_sad_skip_128x64_bits8;
      ppi->fn_ptr[0xe].sdsx4df = aom_highbd_sad_skip_128x64x4d_bits8;
      ppi->fn_ptr[0xd].sdsf = aom_highbd_sad_skip_64x128_bits8;
      ppi->fn_ptr[0xd].sdsx4df = aom_highbd_sad_skip_64x128x4d_bits8;
      ppi->fn_ptr[0xc].sdsf = aom_highbd_sad_skip_64x64_bits8;
      ppi->fn_ptr[0xc].sdsx4df = aom_highbd_sad_skip_64x64x4d_bits8;
      ppi->fn_ptr[0xb].sdsf = aom_highbd_sad_skip_64x32_bits8;
      ppi->fn_ptr[0xb].sdsx4df = aom_highbd_sad_skip_64x32x4d_bits8;
      ppi->fn_ptr[10].sdsf = aom_highbd_sad_skip_32x64_bits8;
      ppi->fn_ptr[10].sdsx4df = aom_highbd_sad_skip_32x64x4d_bits8;
      ppi->fn_ptr[9].sdsf = aom_highbd_sad_skip_32x32_bits8;
      ppi->fn_ptr[9].sdsx4df = aom_highbd_sad_skip_32x32x4d_bits8;
      ppi->fn_ptr[8].sdsf = aom_highbd_sad_skip_32x16_bits8;
      ppi->fn_ptr[8].sdsx4df = aom_highbd_sad_skip_32x16x4d_bits8;
      ppi->fn_ptr[7].sdsf = aom_highbd_sad_skip_16x32_bits8;
      ppi->fn_ptr[7].sdsx4df = aom_highbd_sad_skip_16x32x4d_bits8;
      ppi->fn_ptr[6].sdsf = aom_highbd_sad_skip_16x16_bits8;
      ppi->fn_ptr[6].sdsx4df = aom_highbd_sad_skip_16x16x4d_bits8;
      ppi->fn_ptr[4].sdsf = aom_highbd_sad_skip_8x16_bits8;
      ppi->fn_ptr[4].sdsx4df = aom_highbd_sad_skip_8x16x4d_bits8;
      ppi->fn_ptr[0x15].sdsf = aom_highbd_sad_skip_64x16_bits8;
      ppi->fn_ptr[0x15].sdsx4df = aom_highbd_sad_skip_64x16x4d_bits8;
      ppi->fn_ptr[0x14].sdsf = aom_highbd_sad_skip_16x64_bits8;
      ppi->fn_ptr[0x14].sdsx4df = aom_highbd_sad_skip_16x64x4d_bits8;
      ppi->fn_ptr[0x12].sdsf = aom_highbd_sad_skip_8x32_bits8;
      ppi->fn_ptr[0x12].sdsx4df = aom_highbd_sad_skip_8x32x4d_bits8;
      ppi->fn_ptr[0x10].sdsf = aom_highbd_sad_skip_4x16_bits8;
      ppi->fn_ptr[0x10].sdsx4df = aom_highbd_sad_skip_4x16x4d_bits8;
    }
    else if (aVar1 == AOM_BITS_10) {
      ppi->fn_ptr[0x15].sdf = aom_highbd_sad64x16_bits10;
      ppi->fn_ptr[0x15].sdaf = aom_highbd_sad64x16_avg_bits10;
      ppi->fn_ptr[0x15].vf = (aom_variance_fn_t)aom_highbd_10_variance64x16;
      ppi->fn_ptr[0x15].svf = aom_highbd_10_sub_pixel_variance64x16_sse2;
      ppi->fn_ptr[0x15].svaf = aom_highbd_10_sub_pixel_avg_variance64x16_sse2;
      ppi->fn_ptr[0x15].sdx4df = aom_highbd_sad64x16x4d_bits10;
      ppi->fn_ptr[0x15].sdx3df = aom_highbd_sad64x16x3d_bits10;
      ppi->fn_ptr[0x14].sdf = aom_highbd_sad16x64_bits10;
      ppi->fn_ptr[0x14].sdaf = aom_highbd_sad16x64_avg_bits10;
      ppi->fn_ptr[0x14].vf = (aom_variance_fn_t)aom_highbd_10_variance16x64;
      ppi->fn_ptr[0x14].svf = aom_highbd_10_sub_pixel_variance16x64_sse2;
      ppi->fn_ptr[0x14].svaf = aom_highbd_10_sub_pixel_avg_variance16x64_sse2;
      ppi->fn_ptr[0x14].sdx4df = aom_highbd_sad16x64x4d_bits10;
      ppi->fn_ptr[0x14].sdx3df = aom_highbd_sad16x64x3d_bits10;
      ppi->fn_ptr[0x13].sdf = aom_highbd_sad32x8_bits10;
      ppi->fn_ptr[0x13].sdaf = aom_highbd_sad32x8_avg_bits10;
      ppi->fn_ptr[0x13].vf = (aom_variance_fn_t)aom_highbd_10_variance32x8;
      ppi->fn_ptr[0x13].svf = aom_highbd_10_sub_pixel_variance32x8_sse2;
      ppi->fn_ptr[0x13].svaf = aom_highbd_10_sub_pixel_avg_variance32x8_sse2;
      ppi->fn_ptr[0x13].sdx4df = aom_highbd_sad32x8x4d_bits10;
      ppi->fn_ptr[0x13].sdx3df = aom_highbd_sad32x8x3d_bits10;
      ppi->fn_ptr[0x12].sdf = aom_highbd_sad8x32_bits10;
      ppi->fn_ptr[0x12].sdaf = aom_highbd_sad8x32_avg_bits10;
      ppi->fn_ptr[0x12].vf = (aom_variance_fn_t)aom_highbd_10_variance8x32;
      ppi->fn_ptr[0x12].svf = aom_highbd_10_sub_pixel_variance8x32_sse2;
      ppi->fn_ptr[0x12].svaf = aom_highbd_10_sub_pixel_avg_variance8x32_sse2;
      ppi->fn_ptr[0x12].sdx4df = aom_highbd_sad8x32x4d_bits10;
      ppi->fn_ptr[0x12].sdx3df = aom_highbd_sad8x32x3d_bits10;
      ppi->fn_ptr[0x11].sdf = aom_highbd_sad16x4_bits10;
      ppi->fn_ptr[0x11].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0x11].vf = aom_highbd_10_variance16x4_c;
      ppi->fn_ptr[0x11].svf = aom_highbd_10_sub_pixel_variance16x4_sse2;
      ppi->fn_ptr[0x11].svaf = aom_highbd_10_sub_pixel_avg_variance16x4_sse2;
      ppi->fn_ptr[0x11].sdx4df = aom_highbd_sad16x4x4d_bits10;
      ppi->fn_ptr[0x11].sdx3df = aom_highbd_sad16x4x3d_bits10;
      ppi->fn_ptr[0x10].sdf = aom_highbd_sad4x16_bits10;
      ppi->fn_ptr[0x10].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0x10].vf = aom_highbd_10_variance4x16_c;
      ppi->fn_ptr[0x10].svf = aom_highbd_10_sub_pixel_variance4x16_c;
      ppi->fn_ptr[0x10].svaf = aom_highbd_10_sub_pixel_avg_variance4x16_c;
      ppi->fn_ptr[0x10].sdx4df = aom_highbd_sad4x16x4d_bits10;
      ppi->fn_ptr[0x10].sdx3df = aom_highbd_sad4x16x3d_bits10;
      ppi->fn_ptr[8].sdf = aom_highbd_sad32x16_bits10;
      ppi->fn_ptr[8].sdaf = aom_highbd_sad32x16_avg_bits10;
      ppi->fn_ptr[8].vf = (aom_variance_fn_t)aom_highbd_10_variance32x16;
      ppi->fn_ptr[8].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance32x16;
      ppi->fn_ptr[8].svaf = aom_highbd_10_sub_pixel_avg_variance32x16_sse2;
      ppi->fn_ptr[8].sdx4df = aom_highbd_sad32x16x4d_bits10;
      ppi->fn_ptr[8].sdx3df = aom_highbd_sad32x16x3d_bits10;
      ppi->fn_ptr[7].sdf = aom_highbd_sad16x32_bits10;
      ppi->fn_ptr[7].sdaf = aom_highbd_sad16x32_avg_bits10;
      ppi->fn_ptr[7].vf = (aom_variance_fn_t)aom_highbd_10_variance16x32;
      ppi->fn_ptr[7].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance16x32;
      ppi->fn_ptr[7].svaf = aom_highbd_10_sub_pixel_avg_variance16x32_sse2;
      ppi->fn_ptr[7].sdx4df = aom_highbd_sad16x32x4d_bits10;
      ppi->fn_ptr[7].sdx3df = aom_highbd_sad16x32x3d_bits10;
      ppi->fn_ptr[0xb].sdf = aom_highbd_sad64x32_bits10;
      ppi->fn_ptr[0xb].sdaf = aom_highbd_sad64x32_avg_bits10;
      ppi->fn_ptr[0xb].vf = (aom_variance_fn_t)aom_highbd_10_variance64x32;
      ppi->fn_ptr[0xb].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance64x32;
      ppi->fn_ptr[0xb].svaf = aom_highbd_10_sub_pixel_avg_variance64x32_sse2;
      ppi->fn_ptr[0xb].sdx4df = aom_highbd_sad64x32x4d_bits10;
      ppi->fn_ptr[0xb].sdx3df = aom_highbd_sad64x32x3d_bits10;
      ppi->fn_ptr[10].sdf = aom_highbd_sad32x64_bits10;
      ppi->fn_ptr[10].sdaf = aom_highbd_sad32x64_avg_bits10;
      ppi->fn_ptr[10].vf = (aom_variance_fn_t)aom_highbd_10_variance32x64;
      ppi->fn_ptr[10].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance32x64;
      ppi->fn_ptr[10].svaf = aom_highbd_10_sub_pixel_avg_variance32x64_sse2;
      ppi->fn_ptr[10].sdx4df = aom_highbd_sad32x64x4d_bits10;
      ppi->fn_ptr[10].sdx3df = aom_highbd_sad32x64x3d_bits10;
      ppi->fn_ptr[9].sdf = aom_highbd_sad32x32_bits10;
      ppi->fn_ptr[9].sdaf = aom_highbd_sad32x32_avg_bits10;
      ppi->fn_ptr[9].vf = (aom_variance_fn_t)aom_highbd_10_variance32x32;
      ppi->fn_ptr[9].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance32x32;
      ppi->fn_ptr[9].svaf = aom_highbd_10_sub_pixel_avg_variance32x32_sse2;
      ppi->fn_ptr[9].sdx4df = aom_highbd_sad32x32x4d_bits10;
      ppi->fn_ptr[9].sdx3df = aom_highbd_sad32x32x3d_bits10;
      ppi->fn_ptr[0xc].sdf = aom_highbd_sad64x64_bits10;
      ppi->fn_ptr[0xc].sdaf = aom_highbd_sad64x64_avg_bits10;
      ppi->fn_ptr[0xc].vf = (aom_variance_fn_t)aom_highbd_10_variance64x64;
      ppi->fn_ptr[0xc].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance64x64;
      ppi->fn_ptr[0xc].svaf = aom_highbd_10_sub_pixel_avg_variance64x64_sse2;
      ppi->fn_ptr[0xc].sdx4df = aom_highbd_sad64x64x4d_bits10;
      ppi->fn_ptr[0xc].sdx3df = aom_highbd_sad64x64x3d_bits10;
      ppi->fn_ptr[6].sdf = aom_highbd_sad16x16_bits10;
      ppi->fn_ptr[6].sdaf = aom_highbd_sad16x16_avg_bits10;
      ppi->fn_ptr[6].vf = (aom_variance_fn_t)aom_highbd_10_variance16x16;
      ppi->fn_ptr[6].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance16x16;
      ppi->fn_ptr[6].svaf = aom_highbd_10_sub_pixel_avg_variance16x16_sse2;
      ppi->fn_ptr[6].sdx4df = aom_highbd_sad16x16x4d_bits10;
      ppi->fn_ptr[6].sdx3df = aom_highbd_sad16x16x3d_bits10;
      ppi->fn_ptr[5].sdf = aom_highbd_sad16x8_bits10;
      ppi->fn_ptr[5].sdaf = aom_highbd_sad16x8_avg_bits10;
      ppi->fn_ptr[5].vf = (aom_variance_fn_t)aom_highbd_10_variance16x8;
      ppi->fn_ptr[5].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance16x8;
      ppi->fn_ptr[5].svaf = aom_highbd_10_sub_pixel_avg_variance16x8_sse2;
      ppi->fn_ptr[5].sdx4df = aom_highbd_sad16x8x4d_bits10;
      ppi->fn_ptr[5].sdx3df = aom_highbd_sad16x8x3d_bits10;
      ppi->fn_ptr[4].sdf = aom_highbd_sad8x16_bits10;
      ppi->fn_ptr[4].sdaf = aom_highbd_sad8x16_avg_bits10;
      ppi->fn_ptr[4].vf = (aom_variance_fn_t)aom_highbd_10_variance8x16;
      ppi->fn_ptr[4].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance8x16;
      ppi->fn_ptr[4].svaf = aom_highbd_10_sub_pixel_avg_variance8x16_sse2;
      ppi->fn_ptr[4].sdx4df = aom_highbd_sad8x16x4d_bits10;
      ppi->fn_ptr[4].sdx3df = aom_highbd_sad8x16x3d_bits10;
      ppi->fn_ptr[3].sdf = aom_highbd_sad8x8_bits10;
      ppi->fn_ptr[3].sdaf = aom_highbd_sad8x8_avg_bits10;
      ppi->fn_ptr[3].vf = (aom_variance_fn_t)aom_highbd_10_variance8x8;
      ppi->fn_ptr[3].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance8x8;
      ppi->fn_ptr[3].svaf = aom_highbd_10_sub_pixel_avg_variance8x8_sse2;
      ppi->fn_ptr[3].sdx4df = aom_highbd_sad8x8x4d_bits10;
      ppi->fn_ptr[3].sdx3df = aom_highbd_sad8x8x3d_bits10;
      ppi->fn_ptr[2].sdf = aom_highbd_sad8x4_bits10;
      ppi->fn_ptr[2].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[2].vf = aom_highbd_10_variance8x4_c;
      ppi->fn_ptr[2].svf = aom_highbd_10_sub_pixel_variance8x4_sse2;
      ppi->fn_ptr[2].svaf = aom_highbd_10_sub_pixel_avg_variance8x4_sse2;
      ppi->fn_ptr[2].sdx4df = aom_highbd_sad8x4x4d_bits10;
      ppi->fn_ptr[2].sdx3df = aom_highbd_sad8x4x3d_bits10;
      ppi->fn_ptr[1].sdf = aom_highbd_sad4x8_bits10;
      ppi->fn_ptr[1].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[1].vf = aom_highbd_10_variance4x8_c;
      ppi->fn_ptr[1].svf = aom_highbd_10_sub_pixel_variance4x8_c;
      ppi->fn_ptr[1].svaf = aom_highbd_10_sub_pixel_avg_variance4x8_c;
      ppi->fn_ptr[1].sdx4df = aom_highbd_sad4x8x4d_bits10;
      ppi->fn_ptr[1].sdx3df = aom_highbd_sad4x8x3d_bits10;
      ppi->fn_ptr[0].sdf = aom_highbd_sad4x4_bits10;
      ppi->fn_ptr[0].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0].vf = (aom_variance_fn_t)aom_highbd_10_variance4x4;
      ppi->fn_ptr[0].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance4x4;
      ppi->fn_ptr[0].svaf = (aom_subp_avg_variance_fn_t)aom_highbd_10_sub_pixel_avg_variance4x4;
      ppi->fn_ptr[0].sdx4df = aom_highbd_sad4x4x4d_bits10;
      ppi->fn_ptr[0].sdx3df = aom_highbd_sad4x4x3d_bits10;
      ppi->fn_ptr[0xf].sdf = aom_highbd_sad128x128_bits10;
      ppi->fn_ptr[0xf].sdaf = aom_highbd_sad128x128_avg_bits10;
      ppi->fn_ptr[0xf].vf = (aom_variance_fn_t)aom_highbd_10_variance128x128;
      ppi->fn_ptr[0xf].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance128x128;
      ppi->fn_ptr[0xf].svaf = aom_highbd_10_sub_pixel_avg_variance128x128_c;
      ppi->fn_ptr[0xf].sdx4df = aom_highbd_sad128x128x4d_bits10;
      ppi->fn_ptr[0xf].sdx3df = aom_highbd_sad128x128x3d_bits10;
      ppi->fn_ptr[0xe].sdf = aom_highbd_sad128x64_bits10;
      ppi->fn_ptr[0xe].sdaf = aom_highbd_sad128x64_avg_bits10;
      ppi->fn_ptr[0xe].vf = (aom_variance_fn_t)aom_highbd_10_variance128x64;
      ppi->fn_ptr[0xe].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance128x64;
      ppi->fn_ptr[0xe].svaf = aom_highbd_10_sub_pixel_avg_variance128x64_c;
      ppi->fn_ptr[0xe].sdx4df = aom_highbd_sad128x64x4d_bits10;
      ppi->fn_ptr[0xe].sdx3df = aom_highbd_sad128x64x3d_bits10;
      ppi->fn_ptr[0xd].sdf = aom_highbd_sad64x128_bits10;
      ppi->fn_ptr[0xd].sdaf = aom_highbd_sad64x128_avg_bits10;
      ppi->fn_ptr[0xd].vf = (aom_variance_fn_t)aom_highbd_10_variance64x128;
      ppi->fn_ptr[0xd].svf = (aom_subpixvariance_fn_t)aom_highbd_10_sub_pixel_variance64x128;
      ppi->fn_ptr[0xd].svaf = aom_highbd_10_sub_pixel_avg_variance64x128_c;
      ppi->fn_ptr[0xd].sdx4df = aom_highbd_sad64x128x4d_bits10;
      ppi->fn_ptr[0xd].sdx3df = aom_highbd_sad64x128x3d_bits10;
      ppi->fn_ptr[0xf].msdf = aom_highbd_masked_sad128x128_bits10;
      ppi->fn_ptr[0xf].msvf = aom_highbd_10_masked_sub_pixel_variance128x128;
      ppi->fn_ptr[0xe].msdf = aom_highbd_masked_sad128x64_bits10;
      ppi->fn_ptr[0xe].msvf = aom_highbd_10_masked_sub_pixel_variance128x64;
      ppi->fn_ptr[0xd].msdf = aom_highbd_masked_sad64x128_bits10;
      ppi->fn_ptr[0xd].msvf = aom_highbd_10_masked_sub_pixel_variance64x128;
      ppi->fn_ptr[0xc].msdf = aom_highbd_masked_sad64x64_bits10;
      ppi->fn_ptr[0xc].msvf = aom_highbd_10_masked_sub_pixel_variance64x64;
      ppi->fn_ptr[0xb].msdf = aom_highbd_masked_sad64x32_bits10;
      ppi->fn_ptr[0xb].msvf = aom_highbd_10_masked_sub_pixel_variance64x32;
      ppi->fn_ptr[10].msdf = aom_highbd_masked_sad32x64_bits10;
      ppi->fn_ptr[10].msvf = aom_highbd_10_masked_sub_pixel_variance32x64;
      ppi->fn_ptr[9].msdf = aom_highbd_masked_sad32x32_bits10;
      ppi->fn_ptr[9].msvf = aom_highbd_10_masked_sub_pixel_variance32x32;
      ppi->fn_ptr[8].msdf = aom_highbd_masked_sad32x16_bits10;
      ppi->fn_ptr[8].msvf = aom_highbd_10_masked_sub_pixel_variance32x16;
      ppi->fn_ptr[7].msdf = aom_highbd_masked_sad16x32_bits10;
      ppi->fn_ptr[7].msvf = aom_highbd_10_masked_sub_pixel_variance16x32;
      ppi->fn_ptr[6].msdf = aom_highbd_masked_sad16x16_bits10;
      ppi->fn_ptr[6].msvf = aom_highbd_10_masked_sub_pixel_variance16x16;
      ppi->fn_ptr[4].msdf = aom_highbd_masked_sad8x16_bits10;
      ppi->fn_ptr[4].msvf = aom_highbd_10_masked_sub_pixel_variance8x16;
      ppi->fn_ptr[5].msdf = aom_highbd_masked_sad16x8_bits10;
      ppi->fn_ptr[5].msvf = aom_highbd_10_masked_sub_pixel_variance16x8;
      ppi->fn_ptr[3].msdf = aom_highbd_masked_sad8x8_bits10;
      ppi->fn_ptr[3].msvf = aom_highbd_10_masked_sub_pixel_variance8x8;
      ppi->fn_ptr[1].msdf = aom_highbd_masked_sad4x8_bits10;
      ppi->fn_ptr[1].msvf = aom_highbd_10_masked_sub_pixel_variance4x8;
      ppi->fn_ptr[2].msdf = aom_highbd_masked_sad8x4_bits10;
      ppi->fn_ptr[2].msvf = aom_highbd_10_masked_sub_pixel_variance8x4;
      ppi->fn_ptr[0].msdf = aom_highbd_masked_sad4x4_bits10;
      ppi->fn_ptr[0].msvf = aom_highbd_10_masked_sub_pixel_variance4x4;
      ppi->fn_ptr[0x15].msdf = aom_highbd_masked_sad64x16_bits10;
      ppi->fn_ptr[0x15].msvf = aom_highbd_10_masked_sub_pixel_variance64x16;
      ppi->fn_ptr[0x14].msdf = aom_highbd_masked_sad16x64_bits10;
      ppi->fn_ptr[0x14].msvf = aom_highbd_10_masked_sub_pixel_variance16x64;
      ppi->fn_ptr[0x13].msdf = aom_highbd_masked_sad32x8_bits10;
      ppi->fn_ptr[0x13].msvf = aom_highbd_10_masked_sub_pixel_variance32x8;
      ppi->fn_ptr[0x12].msdf = aom_highbd_masked_sad8x32_bits10;
      ppi->fn_ptr[0x12].msvf = aom_highbd_10_masked_sub_pixel_variance8x32;
      ppi->fn_ptr[0x11].msdf = aom_highbd_masked_sad16x4_bits10;
      ppi->fn_ptr[0x11].msvf = aom_highbd_10_masked_sub_pixel_variance16x4;
      ppi->fn_ptr[0x10].msdf = aom_highbd_masked_sad4x16_bits10;
      ppi->fn_ptr[0x10].msvf = aom_highbd_10_masked_sub_pixel_variance4x16;
      ppi->fn_ptr[0xf].osdf = aom_highbd_obmc_sad128x128_bits10;
      ppi->fn_ptr[0xf].ovf = aom_highbd_10_obmc_variance128x128;
      ppi->fn_ptr[0xf].osvf = aom_highbd_10_obmc_sub_pixel_variance128x128_c;
      ppi->fn_ptr[0xe].osdf = aom_highbd_obmc_sad128x64_bits10;
      ppi->fn_ptr[0xe].ovf = aom_highbd_10_obmc_variance128x64;
      ppi->fn_ptr[0xe].osvf = aom_highbd_10_obmc_sub_pixel_variance128x64_c;
      ppi->fn_ptr[0xd].osdf = aom_highbd_obmc_sad64x128_bits10;
      ppi->fn_ptr[0xd].ovf = aom_highbd_10_obmc_variance64x128;
      ppi->fn_ptr[0xd].osvf = aom_highbd_10_obmc_sub_pixel_variance64x128_c;
      ppi->fn_ptr[0xc].osdf = aom_highbd_obmc_sad64x64_bits10;
      ppi->fn_ptr[0xc].ovf = aom_highbd_10_obmc_variance64x64;
      ppi->fn_ptr[0xc].osvf = aom_highbd_10_obmc_sub_pixel_variance64x64_c;
      ppi->fn_ptr[0xb].osdf = aom_highbd_obmc_sad64x32_bits10;
      ppi->fn_ptr[0xb].ovf = aom_highbd_10_obmc_variance64x32;
      ppi->fn_ptr[0xb].osvf = aom_highbd_10_obmc_sub_pixel_variance64x32_c;
      ppi->fn_ptr[10].osdf = aom_highbd_obmc_sad32x64_bits10;
      ppi->fn_ptr[10].ovf = aom_highbd_10_obmc_variance32x64;
      ppi->fn_ptr[10].osvf = aom_highbd_10_obmc_sub_pixel_variance32x64_c;
      ppi->fn_ptr[9].osdf = aom_highbd_obmc_sad32x32_bits10;
      ppi->fn_ptr[9].ovf = aom_highbd_10_obmc_variance32x32;
      ppi->fn_ptr[9].osvf = aom_highbd_10_obmc_sub_pixel_variance32x32_c;
      ppi->fn_ptr[8].osdf = aom_highbd_obmc_sad32x16_bits10;
      ppi->fn_ptr[8].ovf = aom_highbd_10_obmc_variance32x16;
      ppi->fn_ptr[8].osvf = aom_highbd_10_obmc_sub_pixel_variance32x16_c;
      ppi->fn_ptr[7].osdf = aom_highbd_obmc_sad16x32_bits10;
      ppi->fn_ptr[7].ovf = aom_highbd_10_obmc_variance16x32;
      ppi->fn_ptr[7].osvf = aom_highbd_10_obmc_sub_pixel_variance16x32_c;
      ppi->fn_ptr[6].osdf = aom_highbd_obmc_sad16x16_bits10;
      ppi->fn_ptr[6].ovf = aom_highbd_10_obmc_variance16x16;
      ppi->fn_ptr[6].osvf = aom_highbd_10_obmc_sub_pixel_variance16x16_c;
      ppi->fn_ptr[4].osdf = aom_highbd_obmc_sad8x16_bits10;
      ppi->fn_ptr[4].ovf = aom_highbd_10_obmc_variance8x16;
      ppi->fn_ptr[4].osvf = aom_highbd_10_obmc_sub_pixel_variance8x16_c;
      ppi->fn_ptr[5].osdf = aom_highbd_obmc_sad16x8_bits10;
      ppi->fn_ptr[5].ovf = aom_highbd_10_obmc_variance16x8;
      ppi->fn_ptr[5].osvf = aom_highbd_10_obmc_sub_pixel_variance16x8_c;
      ppi->fn_ptr[3].osdf = aom_highbd_obmc_sad8x8_bits10;
      ppi->fn_ptr[3].ovf = aom_highbd_10_obmc_variance8x8;
      ppi->fn_ptr[3].osvf = aom_highbd_10_obmc_sub_pixel_variance8x8_c;
      ppi->fn_ptr[1].osdf = aom_highbd_obmc_sad4x8_bits10;
      ppi->fn_ptr[1].ovf = aom_highbd_10_obmc_variance4x8;
      ppi->fn_ptr[1].osvf = aom_highbd_10_obmc_sub_pixel_variance4x8_c;
      ppi->fn_ptr[2].osdf = aom_highbd_obmc_sad8x4_bits10;
      ppi->fn_ptr[2].ovf = aom_highbd_10_obmc_variance8x4;
      ppi->fn_ptr[2].osvf = aom_highbd_10_obmc_sub_pixel_variance8x4_c;
      ppi->fn_ptr[0].osdf = aom_highbd_obmc_sad4x4_bits10;
      ppi->fn_ptr[0].ovf = aom_highbd_10_obmc_variance4x4;
      ppi->fn_ptr[0].osvf = aom_highbd_10_obmc_sub_pixel_variance4x4_c;
      ppi->fn_ptr[0x15].osdf = aom_highbd_obmc_sad64x16_bits10;
      ppi->fn_ptr[0x15].ovf = aom_highbd_10_obmc_variance64x16;
      ppi->fn_ptr[0x15].osvf = aom_highbd_10_obmc_sub_pixel_variance64x16_c;
      ppi->fn_ptr[0x14].osdf = aom_highbd_obmc_sad16x64_bits10;
      ppi->fn_ptr[0x14].ovf = aom_highbd_10_obmc_variance16x64;
      ppi->fn_ptr[0x14].osvf = aom_highbd_10_obmc_sub_pixel_variance16x64_c;
      ppi->fn_ptr[0x13].osdf = aom_highbd_obmc_sad32x8_bits10;
      ppi->fn_ptr[0x13].ovf = aom_highbd_10_obmc_variance32x8;
      ppi->fn_ptr[0x13].osvf = aom_highbd_10_obmc_sub_pixel_variance32x8_c;
      ppi->fn_ptr[0x12].osdf = aom_highbd_obmc_sad8x32_bits10;
      ppi->fn_ptr[0x12].ovf = aom_highbd_10_obmc_variance8x32;
      ppi->fn_ptr[0x12].osvf = aom_highbd_10_obmc_sub_pixel_variance8x32_c;
      ppi->fn_ptr[0x11].osdf = aom_highbd_obmc_sad16x4_bits10;
      ppi->fn_ptr[0x11].ovf = aom_highbd_10_obmc_variance16x4;
      ppi->fn_ptr[0x11].osvf = aom_highbd_10_obmc_sub_pixel_variance16x4_c;
      ppi->fn_ptr[0x10].osdf = aom_highbd_obmc_sad4x16_bits10;
      ppi->fn_ptr[0x10].ovf = aom_highbd_10_obmc_variance4x16;
      ppi->fn_ptr[0x10].osvf = aom_highbd_10_obmc_sub_pixel_variance4x16_c;
      ppi->fn_ptr[0xf].sdsf = aom_highbd_sad_skip_128x128_bits10;
      ppi->fn_ptr[0xf].sdsx4df = aom_highbd_sad_skip_128x128x4d_bits10;
      ppi->fn_ptr[0xe].sdsf = aom_highbd_sad_skip_128x64_bits10;
      ppi->fn_ptr[0xe].sdsx4df = aom_highbd_sad_skip_128x64x4d_bits10;
      ppi->fn_ptr[0xd].sdsf = aom_highbd_sad_skip_64x128_bits10;
      ppi->fn_ptr[0xd].sdsx4df = aom_highbd_sad_skip_64x128x4d_bits10;
      ppi->fn_ptr[0xc].sdsf = aom_highbd_sad_skip_64x64_bits10;
      ppi->fn_ptr[0xc].sdsx4df = aom_highbd_sad_skip_64x64x4d_bits10;
      ppi->fn_ptr[0xb].sdsf = aom_highbd_sad_skip_64x32_bits10;
      ppi->fn_ptr[0xb].sdsx4df = aom_highbd_sad_skip_64x32x4d_bits10;
      ppi->fn_ptr[10].sdsf = aom_highbd_sad_skip_32x64_bits10;
      ppi->fn_ptr[10].sdsx4df = aom_highbd_sad_skip_32x64x4d_bits10;
      ppi->fn_ptr[9].sdsf = aom_highbd_sad_skip_32x32_bits10;
      ppi->fn_ptr[9].sdsx4df = aom_highbd_sad_skip_32x32x4d_bits10;
      ppi->fn_ptr[8].sdsf = aom_highbd_sad_skip_32x16_bits10;
      ppi->fn_ptr[8].sdsx4df = aom_highbd_sad_skip_32x16x4d_bits10;
      ppi->fn_ptr[7].sdsf = aom_highbd_sad_skip_16x32_bits10;
      ppi->fn_ptr[7].sdsx4df = aom_highbd_sad_skip_16x32x4d_bits10;
      ppi->fn_ptr[6].sdsf = aom_highbd_sad_skip_16x16_bits10;
      ppi->fn_ptr[6].sdsx4df = aom_highbd_sad_skip_16x16x4d_bits10;
      ppi->fn_ptr[4].sdsf = aom_highbd_sad_skip_8x16_bits10;
      ppi->fn_ptr[4].sdsx4df = aom_highbd_sad_skip_8x16x4d_bits10;
      ppi->fn_ptr[0x15].sdsf = aom_highbd_sad_skip_64x16_bits10;
      ppi->fn_ptr[0x15].sdsx4df = aom_highbd_sad_skip_64x16x4d_bits10;
      ppi->fn_ptr[0x14].sdsf = aom_highbd_sad_skip_16x64_bits10;
      ppi->fn_ptr[0x14].sdsx4df = aom_highbd_sad_skip_16x64x4d_bits10;
      ppi->fn_ptr[0x12].sdsf = aom_highbd_sad_skip_8x32_bits10;
      ppi->fn_ptr[0x12].sdsx4df = aom_highbd_sad_skip_8x32x4d_bits10;
      ppi->fn_ptr[0x10].sdsf = aom_highbd_sad_skip_4x16_bits10;
      ppi->fn_ptr[0x10].sdsx4df = aom_highbd_sad_skip_4x16x4d_bits10;
    }
    else if (aVar1 == AOM_BITS_12) {
      ppi->fn_ptr[0x15].sdf = aom_highbd_sad64x16_bits12;
      ppi->fn_ptr[0x15].sdaf = aom_highbd_sad64x16_avg_bits12;
      ppi->fn_ptr[0x15].vf = aom_highbd_12_variance64x16_sse2;
      ppi->fn_ptr[0x15].svf = aom_highbd_12_sub_pixel_variance64x16_sse2;
      ppi->fn_ptr[0x15].svaf = aom_highbd_12_sub_pixel_avg_variance64x16_sse2;
      ppi->fn_ptr[0x15].sdx4df = aom_highbd_sad64x16x4d_bits12;
      ppi->fn_ptr[0x15].sdx3df = aom_highbd_sad64x16x3d_bits12;
      ppi->fn_ptr[0x14].sdf = aom_highbd_sad16x64_bits12;
      ppi->fn_ptr[0x14].sdaf = aom_highbd_sad16x64_avg_bits12;
      ppi->fn_ptr[0x14].vf = aom_highbd_12_variance16x64_sse2;
      ppi->fn_ptr[0x14].svf = aom_highbd_12_sub_pixel_variance16x64_sse2;
      ppi->fn_ptr[0x14].svaf = aom_highbd_12_sub_pixel_avg_variance16x64_sse2;
      ppi->fn_ptr[0x14].sdx4df = aom_highbd_sad16x64x4d_bits12;
      ppi->fn_ptr[0x14].sdx3df = aom_highbd_sad16x64x3d_bits12;
      ppi->fn_ptr[0x13].sdf = aom_highbd_sad32x8_bits12;
      ppi->fn_ptr[0x13].sdaf = aom_highbd_sad32x8_avg_bits12;
      ppi->fn_ptr[0x13].vf = aom_highbd_12_variance32x8_sse2;
      ppi->fn_ptr[0x13].svf = aom_highbd_12_sub_pixel_variance32x8_sse2;
      ppi->fn_ptr[0x13].svaf = aom_highbd_12_sub_pixel_avg_variance32x8_sse2;
      ppi->fn_ptr[0x13].sdx4df = aom_highbd_sad32x8x4d_bits12;
      ppi->fn_ptr[0x13].sdx3df = aom_highbd_sad32x8x3d_bits12;
      ppi->fn_ptr[0x12].sdf = aom_highbd_sad8x32_bits12;
      ppi->fn_ptr[0x12].sdaf = aom_highbd_sad8x32_avg_bits12;
      ppi->fn_ptr[0x12].vf = aom_highbd_12_variance8x32_sse2;
      ppi->fn_ptr[0x12].svf = aom_highbd_12_sub_pixel_variance8x32_sse2;
      ppi->fn_ptr[0x12].svaf = aom_highbd_12_sub_pixel_avg_variance8x32_sse2;
      ppi->fn_ptr[0x12].sdx4df = aom_highbd_sad8x32x4d_bits12;
      ppi->fn_ptr[0x12].sdx3df = aom_highbd_sad8x32x3d_bits12;
      ppi->fn_ptr[0x11].sdf = aom_highbd_sad16x4_bits12;
      ppi->fn_ptr[0x11].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0x11].vf = aom_highbd_12_variance16x4_c;
      ppi->fn_ptr[0x11].svf = aom_highbd_12_sub_pixel_variance16x4_sse2;
      ppi->fn_ptr[0x11].svaf = aom_highbd_12_sub_pixel_avg_variance16x4_sse2;
      ppi->fn_ptr[0x11].sdx4df = aom_highbd_sad16x4x4d_bits12;
      ppi->fn_ptr[0x11].sdx3df = aom_highbd_sad16x4x3d_bits12;
      ppi->fn_ptr[0x10].sdf = aom_highbd_sad4x16_bits12;
      ppi->fn_ptr[0x10].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0x10].vf = aom_highbd_12_variance4x16_c;
      ppi->fn_ptr[0x10].svf = aom_highbd_12_sub_pixel_variance4x16_c;
      ppi->fn_ptr[0x10].svaf = aom_highbd_12_sub_pixel_avg_variance4x16_c;
      ppi->fn_ptr[0x10].sdx4df = aom_highbd_sad4x16x4d_bits12;
      ppi->fn_ptr[0x10].sdx3df = aom_highbd_sad4x16x3d_bits12;
      ppi->fn_ptr[8].sdf = aom_highbd_sad32x16_bits12;
      ppi->fn_ptr[8].sdaf = aom_highbd_sad32x16_avg_bits12;
      ppi->fn_ptr[8].vf = aom_highbd_12_variance32x16_sse2;
      ppi->fn_ptr[8].svf = aom_highbd_12_sub_pixel_variance32x16_sse2;
      ppi->fn_ptr[8].svaf = aom_highbd_12_sub_pixel_avg_variance32x16_sse2;
      ppi->fn_ptr[8].sdx4df = aom_highbd_sad32x16x4d_bits12;
      ppi->fn_ptr[8].sdx3df = aom_highbd_sad32x16x3d_bits12;
      ppi->fn_ptr[7].sdf = aom_highbd_sad16x32_bits12;
      ppi->fn_ptr[7].sdaf = aom_highbd_sad16x32_avg_bits12;
      ppi->fn_ptr[7].vf = aom_highbd_12_variance16x32_sse2;
      ppi->fn_ptr[7].svf = aom_highbd_12_sub_pixel_variance16x32_sse2;
      ppi->fn_ptr[7].svaf = aom_highbd_12_sub_pixel_avg_variance16x32_sse2;
      ppi->fn_ptr[7].sdx4df = aom_highbd_sad16x32x4d_bits12;
      ppi->fn_ptr[7].sdx3df = aom_highbd_sad16x32x3d_bits12;
      ppi->fn_ptr[0xb].sdf = aom_highbd_sad64x32_bits12;
      ppi->fn_ptr[0xb].sdaf = aom_highbd_sad64x32_avg_bits12;
      ppi->fn_ptr[0xb].vf = aom_highbd_12_variance64x32_sse2;
      ppi->fn_ptr[0xb].svf = aom_highbd_12_sub_pixel_variance64x32_sse2;
      ppi->fn_ptr[0xb].svaf = aom_highbd_12_sub_pixel_avg_variance64x32_sse2;
      ppi->fn_ptr[0xb].sdx4df = aom_highbd_sad64x32x4d_bits12;
      ppi->fn_ptr[0xb].sdx3df = aom_highbd_sad64x32x3d_bits12;
      ppi->fn_ptr[10].sdf = aom_highbd_sad32x64_bits12;
      ppi->fn_ptr[10].sdaf = aom_highbd_sad32x64_avg_bits12;
      ppi->fn_ptr[10].vf = aom_highbd_12_variance32x64_sse2;
      ppi->fn_ptr[10].svf = aom_highbd_12_sub_pixel_variance32x64_sse2;
      ppi->fn_ptr[10].svaf = aom_highbd_12_sub_pixel_avg_variance32x64_sse2;
      ppi->fn_ptr[10].sdx4df = aom_highbd_sad32x64x4d_bits12;
      ppi->fn_ptr[10].sdx3df = aom_highbd_sad32x64x3d_bits12;
      ppi->fn_ptr[9].sdf = aom_highbd_sad32x32_bits12;
      ppi->fn_ptr[9].sdaf = aom_highbd_sad32x32_avg_bits12;
      ppi->fn_ptr[9].vf = aom_highbd_12_variance32x32_sse2;
      ppi->fn_ptr[9].svf = aom_highbd_12_sub_pixel_variance32x32_sse2;
      ppi->fn_ptr[9].svaf = aom_highbd_12_sub_pixel_avg_variance32x32_sse2;
      ppi->fn_ptr[9].sdx4df = aom_highbd_sad32x32x4d_bits12;
      ppi->fn_ptr[9].sdx3df = aom_highbd_sad32x32x3d_bits12;
      ppi->fn_ptr[0xc].sdf = aom_highbd_sad64x64_bits12;
      ppi->fn_ptr[0xc].sdaf = aom_highbd_sad64x64_avg_bits12;
      ppi->fn_ptr[0xc].vf = aom_highbd_12_variance64x64_sse2;
      ppi->fn_ptr[0xc].svf = aom_highbd_12_sub_pixel_variance64x64_sse2;
      ppi->fn_ptr[0xc].svaf = aom_highbd_12_sub_pixel_avg_variance64x64_sse2;
      ppi->fn_ptr[0xc].sdx4df = aom_highbd_sad64x64x4d_bits12;
      ppi->fn_ptr[0xc].sdx3df = aom_highbd_sad64x64x3d_bits12;
      ppi->fn_ptr[6].sdf = aom_highbd_sad16x16_bits12;
      ppi->fn_ptr[6].sdaf = aom_highbd_sad16x16_avg_bits12;
      ppi->fn_ptr[6].vf = aom_highbd_12_variance16x16_sse2;
      ppi->fn_ptr[6].svf = aom_highbd_12_sub_pixel_variance16x16_sse2;
      ppi->fn_ptr[6].svaf = aom_highbd_12_sub_pixel_avg_variance16x16_sse2;
      ppi->fn_ptr[6].sdx4df = aom_highbd_sad16x16x4d_bits12;
      ppi->fn_ptr[6].sdx3df = aom_highbd_sad16x16x3d_bits12;
      ppi->fn_ptr[5].sdf = aom_highbd_sad16x8_bits12;
      ppi->fn_ptr[5].sdaf = aom_highbd_sad16x8_avg_bits12;
      ppi->fn_ptr[5].vf = aom_highbd_12_variance16x8_sse2;
      ppi->fn_ptr[5].svf = aom_highbd_12_sub_pixel_variance16x8_sse2;
      ppi->fn_ptr[5].svaf = aom_highbd_12_sub_pixel_avg_variance16x8_sse2;
      ppi->fn_ptr[5].sdx4df = aom_highbd_sad16x8x4d_bits12;
      ppi->fn_ptr[5].sdx3df = aom_highbd_sad16x8x3d_bits12;
      ppi->fn_ptr[4].sdf = aom_highbd_sad8x16_bits12;
      ppi->fn_ptr[4].sdaf = aom_highbd_sad8x16_avg_bits12;
      ppi->fn_ptr[4].vf = aom_highbd_12_variance8x16_sse2;
      ppi->fn_ptr[4].svf = aom_highbd_12_sub_pixel_variance8x16_sse2;
      ppi->fn_ptr[4].svaf = aom_highbd_12_sub_pixel_avg_variance8x16_sse2;
      ppi->fn_ptr[4].sdx4df = aom_highbd_sad8x16x4d_bits12;
      ppi->fn_ptr[4].sdx3df = aom_highbd_sad8x16x3d_bits12;
      ppi->fn_ptr[3].sdf = aom_highbd_sad8x8_bits12;
      ppi->fn_ptr[3].sdaf = aom_highbd_sad8x8_avg_bits12;
      ppi->fn_ptr[3].vf = aom_highbd_12_variance8x8_sse2;
      ppi->fn_ptr[3].svf = aom_highbd_12_sub_pixel_variance8x8_sse2;
      ppi->fn_ptr[3].svaf = aom_highbd_12_sub_pixel_avg_variance8x8_sse2;
      ppi->fn_ptr[3].sdx4df = aom_highbd_sad8x8x4d_bits12;
      ppi->fn_ptr[3].sdx3df = aom_highbd_sad8x8x3d_bits12;
      ppi->fn_ptr[2].sdf = aom_highbd_sad8x4_bits12;
      ppi->fn_ptr[2].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[2].vf = aom_highbd_12_variance8x4_c;
      ppi->fn_ptr[2].svf = aom_highbd_12_sub_pixel_variance8x4_sse2;
      ppi->fn_ptr[2].svaf = aom_highbd_12_sub_pixel_avg_variance8x4_sse2;
      ppi->fn_ptr[2].sdx4df = aom_highbd_sad8x4x4d_bits12;
      ppi->fn_ptr[2].sdx3df = aom_highbd_sad8x4x3d_bits12;
      ppi->fn_ptr[1].sdf = aom_highbd_sad4x8_bits12;
      ppi->fn_ptr[1].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[1].vf = aom_highbd_12_variance4x8_c;
      ppi->fn_ptr[1].svf = aom_highbd_12_sub_pixel_variance4x8_c;
      ppi->fn_ptr[1].svaf = aom_highbd_12_sub_pixel_avg_variance4x8_c;
      ppi->fn_ptr[1].sdx4df = aom_highbd_sad4x8x4d_bits12;
      ppi->fn_ptr[1].sdx3df = aom_highbd_sad4x8x3d_bits12;
      ppi->fn_ptr[0].sdf = aom_highbd_sad4x4_bits12;
      ppi->fn_ptr[0].sdaf = (aom_sad_avg_fn_t)0x0;
      ppi->fn_ptr[0].vf = (aom_variance_fn_t)aom_highbd_12_variance4x4;
      ppi->fn_ptr[0].svf = (aom_subpixvariance_fn_t)aom_highbd_12_sub_pixel_variance4x4;
      ppi->fn_ptr[0].svaf = (aom_subp_avg_variance_fn_t)aom_highbd_12_sub_pixel_avg_variance4x4;
      ppi->fn_ptr[0].sdx4df = aom_highbd_sad4x4x4d_bits12;
      ppi->fn_ptr[0].sdx3df = aom_highbd_sad4x4x3d_bits12;
      ppi->fn_ptr[0xf].sdf = aom_highbd_sad128x128_bits12;
      ppi->fn_ptr[0xf].sdaf = aom_highbd_sad128x128_avg_bits12;
      ppi->fn_ptr[0xf].vf = aom_highbd_12_variance128x128_sse2;
      ppi->fn_ptr[0xf].svf = aom_highbd_12_sub_pixel_variance128x128_sse2;
      ppi->fn_ptr[0xf].svaf = aom_highbd_12_sub_pixel_avg_variance128x128_c;
      ppi->fn_ptr[0xf].sdx4df = aom_highbd_sad128x128x4d_bits12;
      ppi->fn_ptr[0xf].sdx3df = aom_highbd_sad128x128x3d_bits12;
      ppi->fn_ptr[0xe].sdf = aom_highbd_sad128x64_bits12;
      ppi->fn_ptr[0xe].sdaf = aom_highbd_sad128x64_avg_bits12;
      ppi->fn_ptr[0xe].vf = aom_highbd_12_variance128x64_sse2;
      ppi->fn_ptr[0xe].svf = aom_highbd_12_sub_pixel_variance128x64_sse2;
      ppi->fn_ptr[0xe].svaf = aom_highbd_12_sub_pixel_avg_variance128x64_c;
      ppi->fn_ptr[0xe].sdx4df = aom_highbd_sad128x64x4d_bits12;
      ppi->fn_ptr[0xe].sdx3df = aom_highbd_sad128x64x3d_bits12;
      ppi->fn_ptr[0xd].sdf = aom_highbd_sad64x128_bits12;
      ppi->fn_ptr[0xd].sdaf = aom_highbd_sad64x128_avg_bits12;
      ppi->fn_ptr[0xd].vf = aom_highbd_12_variance64x128_sse2;
      ppi->fn_ptr[0xd].svf = aom_highbd_12_sub_pixel_variance64x128_sse2;
      ppi->fn_ptr[0xd].svaf = aom_highbd_12_sub_pixel_avg_variance64x128_c;
      ppi->fn_ptr[0xd].sdx4df = aom_highbd_sad64x128x4d_bits12;
      ppi->fn_ptr[0xd].sdx3df = aom_highbd_sad64x128x3d_bits12;
      ppi->fn_ptr[0xf].msdf = aom_highbd_masked_sad128x128_bits12;
      ppi->fn_ptr[0xf].msvf = aom_highbd_12_masked_sub_pixel_variance128x128;
      ppi->fn_ptr[0xe].msdf = aom_highbd_masked_sad128x64_bits12;
      ppi->fn_ptr[0xe].msvf = aom_highbd_12_masked_sub_pixel_variance128x64;
      ppi->fn_ptr[0xd].msdf = aom_highbd_masked_sad64x128_bits12;
      ppi->fn_ptr[0xd].msvf = aom_highbd_12_masked_sub_pixel_variance64x128;
      ppi->fn_ptr[0xc].msdf = aom_highbd_masked_sad64x64_bits12;
      ppi->fn_ptr[0xc].msvf = aom_highbd_12_masked_sub_pixel_variance64x64;
      ppi->fn_ptr[0xb].msdf = aom_highbd_masked_sad64x32_bits12;
      ppi->fn_ptr[0xb].msvf = aom_highbd_12_masked_sub_pixel_variance64x32;
      ppi->fn_ptr[10].msdf = aom_highbd_masked_sad32x64_bits12;
      ppi->fn_ptr[10].msvf = aom_highbd_12_masked_sub_pixel_variance32x64;
      ppi->fn_ptr[9].msdf = aom_highbd_masked_sad32x32_bits12;
      ppi->fn_ptr[9].msvf = aom_highbd_12_masked_sub_pixel_variance32x32;
      ppi->fn_ptr[8].msdf = aom_highbd_masked_sad32x16_bits12;
      ppi->fn_ptr[8].msvf = aom_highbd_12_masked_sub_pixel_variance32x16;
      ppi->fn_ptr[7].msdf = aom_highbd_masked_sad16x32_bits12;
      ppi->fn_ptr[7].msvf = aom_highbd_12_masked_sub_pixel_variance16x32;
      ppi->fn_ptr[6].msdf = aom_highbd_masked_sad16x16_bits12;
      ppi->fn_ptr[6].msvf = aom_highbd_12_masked_sub_pixel_variance16x16;
      ppi->fn_ptr[4].msdf = aom_highbd_masked_sad8x16_bits12;
      ppi->fn_ptr[4].msvf = aom_highbd_12_masked_sub_pixel_variance8x16;
      ppi->fn_ptr[5].msdf = aom_highbd_masked_sad16x8_bits12;
      ppi->fn_ptr[5].msvf = aom_highbd_12_masked_sub_pixel_variance16x8;
      ppi->fn_ptr[3].msdf = aom_highbd_masked_sad8x8_bits12;
      ppi->fn_ptr[3].msvf = aom_highbd_12_masked_sub_pixel_variance8x8;
      ppi->fn_ptr[1].msdf = aom_highbd_masked_sad4x8_bits12;
      ppi->fn_ptr[1].msvf = aom_highbd_12_masked_sub_pixel_variance4x8;
      ppi->fn_ptr[2].msdf = aom_highbd_masked_sad8x4_bits12;
      ppi->fn_ptr[2].msvf = aom_highbd_12_masked_sub_pixel_variance8x4;
      ppi->fn_ptr[0].msdf = aom_highbd_masked_sad4x4_bits12;
      ppi->fn_ptr[0].msvf = aom_highbd_12_masked_sub_pixel_variance4x4;
      ppi->fn_ptr[0x15].msdf = aom_highbd_masked_sad64x16_bits12;
      ppi->fn_ptr[0x15].msvf = aom_highbd_12_masked_sub_pixel_variance64x16;
      ppi->fn_ptr[0x14].msdf = aom_highbd_masked_sad16x64_bits12;
      ppi->fn_ptr[0x14].msvf = aom_highbd_12_masked_sub_pixel_variance16x64;
      ppi->fn_ptr[0x13].msdf = aom_highbd_masked_sad32x8_bits12;
      ppi->fn_ptr[0x13].msvf = aom_highbd_12_masked_sub_pixel_variance32x8;
      ppi->fn_ptr[0x12].msdf = aom_highbd_masked_sad8x32_bits12;
      ppi->fn_ptr[0x12].msvf = aom_highbd_12_masked_sub_pixel_variance8x32;
      ppi->fn_ptr[0x11].msdf = aom_highbd_masked_sad16x4_bits12;
      ppi->fn_ptr[0x11].msvf = aom_highbd_12_masked_sub_pixel_variance16x4;
      ppi->fn_ptr[0x10].msdf = aom_highbd_masked_sad4x16_bits12;
      ppi->fn_ptr[0x10].msvf = aom_highbd_12_masked_sub_pixel_variance4x16;
      ppi->fn_ptr[0xf].osdf = aom_highbd_obmc_sad128x128_bits12;
      ppi->fn_ptr[0xf].ovf = aom_highbd_12_obmc_variance128x128;
      ppi->fn_ptr[0xf].osvf = aom_highbd_12_obmc_sub_pixel_variance128x128_c;
      ppi->fn_ptr[0xe].osdf = aom_highbd_obmc_sad128x64_bits12;
      ppi->fn_ptr[0xe].ovf = aom_highbd_12_obmc_variance128x64;
      ppi->fn_ptr[0xe].osvf = aom_highbd_12_obmc_sub_pixel_variance128x64_c;
      ppi->fn_ptr[0xd].osdf = aom_highbd_obmc_sad64x128_bits12;
      ppi->fn_ptr[0xd].ovf = aom_highbd_12_obmc_variance64x128;
      ppi->fn_ptr[0xd].osvf = aom_highbd_12_obmc_sub_pixel_variance64x128_c;
      ppi->fn_ptr[0xc].osdf = aom_highbd_obmc_sad64x64_bits12;
      ppi->fn_ptr[0xc].ovf = aom_highbd_12_obmc_variance64x64;
      ppi->fn_ptr[0xc].osvf = aom_highbd_12_obmc_sub_pixel_variance64x64_c;
      ppi->fn_ptr[0xb].osdf = aom_highbd_obmc_sad64x32_bits12;
      ppi->fn_ptr[0xb].ovf = aom_highbd_12_obmc_variance64x32;
      ppi->fn_ptr[0xb].osvf = aom_highbd_12_obmc_sub_pixel_variance64x32_c;
      ppi->fn_ptr[10].osdf = aom_highbd_obmc_sad32x64_bits12;
      ppi->fn_ptr[10].ovf = aom_highbd_12_obmc_variance32x64;
      ppi->fn_ptr[10].osvf = aom_highbd_12_obmc_sub_pixel_variance32x64_c;
      ppi->fn_ptr[9].osdf = aom_highbd_obmc_sad32x32_bits12;
      ppi->fn_ptr[9].ovf = aom_highbd_12_obmc_variance32x32;
      ppi->fn_ptr[9].osvf = aom_highbd_12_obmc_sub_pixel_variance32x32_c;
      ppi->fn_ptr[8].osdf = aom_highbd_obmc_sad32x16_bits12;
      ppi->fn_ptr[8].ovf = aom_highbd_12_obmc_variance32x16;
      ppi->fn_ptr[8].osvf = aom_highbd_12_obmc_sub_pixel_variance32x16_c;
      ppi->fn_ptr[7].osdf = aom_highbd_obmc_sad16x32_bits12;
      ppi->fn_ptr[7].ovf = aom_highbd_12_obmc_variance16x32;
      ppi->fn_ptr[7].osvf = aom_highbd_12_obmc_sub_pixel_variance16x32_c;
      ppi->fn_ptr[6].osdf = aom_highbd_obmc_sad16x16_bits12;
      ppi->fn_ptr[6].ovf = aom_highbd_12_obmc_variance16x16;
      ppi->fn_ptr[6].osvf = aom_highbd_12_obmc_sub_pixel_variance16x16_c;
      ppi->fn_ptr[4].osdf = aom_highbd_obmc_sad8x16_bits12;
      ppi->fn_ptr[4].ovf = aom_highbd_12_obmc_variance8x16;
      ppi->fn_ptr[4].osvf = aom_highbd_12_obmc_sub_pixel_variance8x16_c;
      ppi->fn_ptr[5].osdf = aom_highbd_obmc_sad16x8_bits12;
      ppi->fn_ptr[5].ovf = aom_highbd_12_obmc_variance16x8;
      ppi->fn_ptr[5].osvf = aom_highbd_12_obmc_sub_pixel_variance16x8_c;
      ppi->fn_ptr[3].osdf = aom_highbd_obmc_sad8x8_bits12;
      ppi->fn_ptr[3].ovf = aom_highbd_12_obmc_variance8x8;
      ppi->fn_ptr[3].osvf = aom_highbd_12_obmc_sub_pixel_variance8x8_c;
      ppi->fn_ptr[1].osdf = aom_highbd_obmc_sad4x8_bits12;
      ppi->fn_ptr[1].ovf = aom_highbd_12_obmc_variance4x8;
      ppi->fn_ptr[1].osvf = aom_highbd_12_obmc_sub_pixel_variance4x8_c;
      ppi->fn_ptr[2].osdf = aom_highbd_obmc_sad8x4_bits12;
      ppi->fn_ptr[2].ovf = aom_highbd_12_obmc_variance8x4;
      ppi->fn_ptr[2].osvf = aom_highbd_12_obmc_sub_pixel_variance8x4_c;
      ppi->fn_ptr[0].osdf = aom_highbd_obmc_sad4x4_bits12;
      ppi->fn_ptr[0].ovf = aom_highbd_12_obmc_variance4x4;
      ppi->fn_ptr[0].osvf = aom_highbd_12_obmc_sub_pixel_variance4x4_c;
      ppi->fn_ptr[0x15].osdf = aom_highbd_obmc_sad64x16_bits12;
      ppi->fn_ptr[0x15].ovf = aom_highbd_12_obmc_variance64x16;
      ppi->fn_ptr[0x15].osvf = aom_highbd_12_obmc_sub_pixel_variance64x16_c;
      ppi->fn_ptr[0x14].osdf = aom_highbd_obmc_sad16x64_bits12;
      ppi->fn_ptr[0x14].ovf = aom_highbd_12_obmc_variance16x64;
      ppi->fn_ptr[0x14].osvf = aom_highbd_12_obmc_sub_pixel_variance16x64_c;
      ppi->fn_ptr[0x13].osdf = aom_highbd_obmc_sad32x8_bits12;
      ppi->fn_ptr[0x13].ovf = aom_highbd_12_obmc_variance32x8;
      ppi->fn_ptr[0x13].osvf = aom_highbd_12_obmc_sub_pixel_variance32x8_c;
      ppi->fn_ptr[0x12].osdf = aom_highbd_obmc_sad8x32_bits12;
      ppi->fn_ptr[0x12].ovf = aom_highbd_12_obmc_variance8x32;
      ppi->fn_ptr[0x12].osvf = aom_highbd_12_obmc_sub_pixel_variance8x32_c;
      ppi->fn_ptr[0x11].osdf = aom_highbd_obmc_sad16x4_bits12;
      ppi->fn_ptr[0x11].ovf = aom_highbd_12_obmc_variance16x4;
      ppi->fn_ptr[0x11].osvf = aom_highbd_12_obmc_sub_pixel_variance16x4_c;
      ppi->fn_ptr[0x10].osdf = aom_highbd_obmc_sad4x16_bits12;
      ppi->fn_ptr[0x10].ovf = aom_highbd_12_obmc_variance4x16;
      ppi->fn_ptr[0x10].osvf = aom_highbd_12_obmc_sub_pixel_variance4x16_c;
      ppi->fn_ptr[0xf].sdsf = aom_highbd_sad_skip_128x128_bits12;
      ppi->fn_ptr[0xf].sdsx4df = aom_highbd_sad_skip_128x128x4d_bits12;
      ppi->fn_ptr[0xe].sdsf = aom_highbd_sad_skip_128x64_bits12;
      ppi->fn_ptr[0xe].sdsx4df = aom_highbd_sad_skip_128x64x4d_bits12;
      ppi->fn_ptr[0xd].sdsf = aom_highbd_sad_skip_64x128_bits12;
      ppi->fn_ptr[0xd].sdsx4df = aom_highbd_sad_skip_64x128x4d_bits12;
      ppi->fn_ptr[0xc].sdsf = aom_highbd_sad_skip_64x64_bits12;
      ppi->fn_ptr[0xc].sdsx4df = aom_highbd_sad_skip_64x64x4d_bits12;
      ppi->fn_ptr[0xb].sdsf = aom_highbd_sad_skip_64x32_bits12;
      ppi->fn_ptr[0xb].sdsx4df = aom_highbd_sad_skip_64x32x4d_bits12;
      ppi->fn_ptr[10].sdsf = aom_highbd_sad_skip_32x64_bits12;
      ppi->fn_ptr[10].sdsx4df = aom_highbd_sad_skip_32x64x4d_bits12;
      ppi->fn_ptr[9].sdsf = aom_highbd_sad_skip_32x32_bits12;
      ppi->fn_ptr[9].sdsx4df = aom_highbd_sad_skip_32x32x4d_bits12;
      ppi->fn_ptr[8].sdsf = aom_highbd_sad_skip_32x16_bits12;
      ppi->fn_ptr[8].sdsx4df = aom_highbd_sad_skip_32x16x4d_bits12;
      ppi->fn_ptr[7].sdsf = aom_highbd_sad_skip_16x32_bits12;
      ppi->fn_ptr[7].sdsx4df = aom_highbd_sad_skip_16x32x4d_bits12;
      ppi->fn_ptr[6].sdsf = aom_highbd_sad_skip_16x16_bits12;
      ppi->fn_ptr[6].sdsx4df = aom_highbd_sad_skip_16x16x4d_bits12;
      ppi->fn_ptr[4].sdsf = aom_highbd_sad_skip_8x16_bits12;
      ppi->fn_ptr[4].sdsx4df = aom_highbd_sad_skip_8x16x4d_bits12;
      ppi->fn_ptr[0x15].sdsf = aom_highbd_sad_skip_64x16_bits12;
      ppi->fn_ptr[0x15].sdsx4df = aom_highbd_sad_skip_64x16x4d_bits12;
      ppi->fn_ptr[0x14].sdsf = aom_highbd_sad_skip_16x64_bits12;
      ppi->fn_ptr[0x14].sdsx4df = aom_highbd_sad_skip_16x64x4d_bits12;
      ppi->fn_ptr[0x12].sdsf = aom_highbd_sad_skip_8x32_bits12;
      ppi->fn_ptr[0x12].sdsx4df = aom_highbd_sad_skip_8x32x4d_bits12;
      ppi->fn_ptr[0x10].sdsf = aom_highbd_sad_skip_4x16_bits12;
      ppi->fn_ptr[0x10].sdsx4df = aom_highbd_sad_skip_4x16x4d_bits12;
    }
  }
  return;
}

Assistant:

static inline void highbd_set_var_fns(AV1_PRIMARY *const ppi) {
  SequenceHeader *const seq_params = &ppi->seq_params;
  if (seq_params->use_highbitdepth) {
    switch (seq_params->bit_depth) {
      case AOM_BITS_8:
#if !CONFIG_REALTIME_ONLY
        HIGHBD_BFP_WRAPPER(64, 16, 8)
        HIGHBD_BFP_WRAPPER(16, 64, 8)
        HIGHBD_BFP_WRAPPER(32, 8, 8)
        HIGHBD_BFP_WRAPPER(8, 32, 8)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(16, 4, 8)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 16, 8)
#endif
        HIGHBD_BFP_WRAPPER(32, 16, 8)
        HIGHBD_BFP_WRAPPER(16, 32, 8)
        HIGHBD_BFP_WRAPPER(64, 32, 8)
        HIGHBD_BFP_WRAPPER(32, 64, 8)
        HIGHBD_BFP_WRAPPER(32, 32, 8)
        HIGHBD_BFP_WRAPPER(64, 64, 8)
        HIGHBD_BFP_WRAPPER(16, 16, 8)
        HIGHBD_BFP_WRAPPER(16, 8, 8)
        HIGHBD_BFP_WRAPPER(8, 16, 8)
        HIGHBD_BFP_WRAPPER(8, 8, 8)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(8, 4, 8)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 8, 8)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 4, 8)
        HIGHBD_BFP_WRAPPER(128, 128, 8)
        HIGHBD_BFP_WRAPPER(128, 64, 8)
        HIGHBD_BFP_WRAPPER(64, 128, 8)

        HIGHBD_MBFP_WRAPPER(128, 128, 8)
        HIGHBD_MBFP_WRAPPER(128, 64, 8)
        HIGHBD_MBFP_WRAPPER(64, 128, 8)
        HIGHBD_MBFP_WRAPPER(64, 64, 8)
        HIGHBD_MBFP_WRAPPER(64, 32, 8)
        HIGHBD_MBFP_WRAPPER(32, 64, 8)
        HIGHBD_MBFP_WRAPPER(32, 32, 8)
        HIGHBD_MBFP_WRAPPER(32, 16, 8)
        HIGHBD_MBFP_WRAPPER(16, 32, 8)
        HIGHBD_MBFP_WRAPPER(16, 16, 8)
        HIGHBD_MBFP_WRAPPER(8, 16, 8)
        HIGHBD_MBFP_WRAPPER(16, 8, 8)
        HIGHBD_MBFP_WRAPPER(8, 8, 8)
        HIGHBD_MBFP_WRAPPER(4, 8, 8)
        HIGHBD_MBFP_WRAPPER(8, 4, 8)
        HIGHBD_MBFP_WRAPPER(4, 4, 8)
#if !CONFIG_REALTIME_ONLY
        HIGHBD_MBFP_WRAPPER(64, 16, 8)
        HIGHBD_MBFP_WRAPPER(16, 64, 8)
        HIGHBD_MBFP_WRAPPER(32, 8, 8)
        HIGHBD_MBFP_WRAPPER(8, 32, 8)
        HIGHBD_MBFP_WRAPPER(16, 4, 8)
        HIGHBD_MBFP_WRAPPER(4, 16, 8)
#endif

// OBMC excluded from realtime only build.
#if !CONFIG_REALTIME_ONLY
        HIGHBD_OBFP_WRAPPER_8(128, 128)
        HIGHBD_OBFP_WRAPPER_8(128, 64)
        HIGHBD_OBFP_WRAPPER_8(64, 128)
        HIGHBD_OBFP_WRAPPER_8(64, 64)
        HIGHBD_OBFP_WRAPPER_8(64, 32)
        HIGHBD_OBFP_WRAPPER_8(32, 64)
        HIGHBD_OBFP_WRAPPER_8(32, 32)
        HIGHBD_OBFP_WRAPPER_8(32, 16)
        HIGHBD_OBFP_WRAPPER_8(16, 32)
        HIGHBD_OBFP_WRAPPER_8(16, 16)
        HIGHBD_OBFP_WRAPPER_8(8, 16)
        HIGHBD_OBFP_WRAPPER_8(16, 8)
        HIGHBD_OBFP_WRAPPER_8(8, 8)
        HIGHBD_OBFP_WRAPPER_8(4, 8)
        HIGHBD_OBFP_WRAPPER_8(8, 4)
        HIGHBD_OBFP_WRAPPER_8(4, 4)
        HIGHBD_OBFP_WRAPPER_8(64, 16)
        HIGHBD_OBFP_WRAPPER_8(16, 64)
        HIGHBD_OBFP_WRAPPER_8(32, 8)
        HIGHBD_OBFP_WRAPPER_8(8, 32)
        HIGHBD_OBFP_WRAPPER_8(16, 4)
        HIGHBD_OBFP_WRAPPER_8(4, 16)
#endif

        HIGHBD_SDSFP_WRAPPER(128, 128, 8)
        HIGHBD_SDSFP_WRAPPER(128, 64, 8)
        HIGHBD_SDSFP_WRAPPER(64, 128, 8)
        HIGHBD_SDSFP_WRAPPER(64, 64, 8)
        HIGHBD_SDSFP_WRAPPER(64, 32, 8)
        HIGHBD_SDSFP_WRAPPER(32, 64, 8)
        HIGHBD_SDSFP_WRAPPER(32, 32, 8)
        HIGHBD_SDSFP_WRAPPER(32, 16, 8)
        HIGHBD_SDSFP_WRAPPER(16, 32, 8)
        HIGHBD_SDSFP_WRAPPER(16, 16, 8)
        HIGHBD_SDSFP_WRAPPER(8, 16, 8)
#if !CONFIG_REALTIME_ONLY
        HIGHBD_SDSFP_WRAPPER(64, 16, 8)
        HIGHBD_SDSFP_WRAPPER(16, 64, 8)
        HIGHBD_SDSFP_WRAPPER(8, 32, 8)
        HIGHBD_SDSFP_WRAPPER(4, 16, 8)
#endif
        break;

      case AOM_BITS_10:
#if !CONFIG_REALTIME_ONLY
        HIGHBD_BFP_WRAPPER(64, 16, 10)
        HIGHBD_BFP_WRAPPER(16, 64, 10)
        HIGHBD_BFP_WRAPPER(32, 8, 10)
        HIGHBD_BFP_WRAPPER(8, 32, 10)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(16, 4, 10)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 16, 10)
#endif
        HIGHBD_BFP_WRAPPER(32, 16, 10)
        HIGHBD_BFP_WRAPPER(16, 32, 10)
        HIGHBD_BFP_WRAPPER(64, 32, 10)
        HIGHBD_BFP_WRAPPER(32, 64, 10)
        HIGHBD_BFP_WRAPPER(32, 32, 10)
        HIGHBD_BFP_WRAPPER(64, 64, 10)
        HIGHBD_BFP_WRAPPER(16, 16, 10)
        HIGHBD_BFP_WRAPPER(16, 8, 10)
        HIGHBD_BFP_WRAPPER(8, 16, 10)
        HIGHBD_BFP_WRAPPER(8, 8, 10)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(8, 4, 10)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 8, 10)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 4, 10)
        HIGHBD_BFP_WRAPPER(128, 128, 10)
        HIGHBD_BFP_WRAPPER(128, 64, 10)
        HIGHBD_BFP_WRAPPER(64, 128, 10)

        HIGHBD_MBFP_WRAPPER(128, 128, 10)
        HIGHBD_MBFP_WRAPPER(128, 64, 10)
        HIGHBD_MBFP_WRAPPER(64, 128, 10)
        HIGHBD_MBFP_WRAPPER(64, 64, 10)
        HIGHBD_MBFP_WRAPPER(64, 32, 10)
        HIGHBD_MBFP_WRAPPER(32, 64, 10)
        HIGHBD_MBFP_WRAPPER(32, 32, 10)
        HIGHBD_MBFP_WRAPPER(32, 16, 10)
        HIGHBD_MBFP_WRAPPER(16, 32, 10)
        HIGHBD_MBFP_WRAPPER(16, 16, 10)
        HIGHBD_MBFP_WRAPPER(8, 16, 10)
        HIGHBD_MBFP_WRAPPER(16, 8, 10)
        HIGHBD_MBFP_WRAPPER(8, 8, 10)
        HIGHBD_MBFP_WRAPPER(4, 8, 10)
        HIGHBD_MBFP_WRAPPER(8, 4, 10)
        HIGHBD_MBFP_WRAPPER(4, 4, 10)
#if !CONFIG_REALTIME_ONLY
        HIGHBD_MBFP_WRAPPER(64, 16, 10)
        HIGHBD_MBFP_WRAPPER(16, 64, 10)
        HIGHBD_MBFP_WRAPPER(32, 8, 10)
        HIGHBD_MBFP_WRAPPER(8, 32, 10)
        HIGHBD_MBFP_WRAPPER(16, 4, 10)
        HIGHBD_MBFP_WRAPPER(4, 16, 10)
#endif

// OBMC excluded from realtime only build.
#if !CONFIG_REALTIME_ONLY
        HIGHBD_OBFP_WRAPPER(128, 128, 10)
        HIGHBD_OBFP_WRAPPER(128, 64, 10)
        HIGHBD_OBFP_WRAPPER(64, 128, 10)
        HIGHBD_OBFP_WRAPPER(64, 64, 10)
        HIGHBD_OBFP_WRAPPER(64, 32, 10)
        HIGHBD_OBFP_WRAPPER(32, 64, 10)
        HIGHBD_OBFP_WRAPPER(32, 32, 10)
        HIGHBD_OBFP_WRAPPER(32, 16, 10)
        HIGHBD_OBFP_WRAPPER(16, 32, 10)
        HIGHBD_OBFP_WRAPPER(16, 16, 10)
        HIGHBD_OBFP_WRAPPER(8, 16, 10)
        HIGHBD_OBFP_WRAPPER(16, 8, 10)
        HIGHBD_OBFP_WRAPPER(8, 8, 10)
        HIGHBD_OBFP_WRAPPER(4, 8, 10)
        HIGHBD_OBFP_WRAPPER(8, 4, 10)
        HIGHBD_OBFP_WRAPPER(4, 4, 10)
        HIGHBD_OBFP_WRAPPER(64, 16, 10)
        HIGHBD_OBFP_WRAPPER(16, 64, 10)
        HIGHBD_OBFP_WRAPPER(32, 8, 10)
        HIGHBD_OBFP_WRAPPER(8, 32, 10)
        HIGHBD_OBFP_WRAPPER(16, 4, 10)
        HIGHBD_OBFP_WRAPPER(4, 16, 10)
#endif

        HIGHBD_SDSFP_WRAPPER(128, 128, 10)
        HIGHBD_SDSFP_WRAPPER(128, 64, 10)
        HIGHBD_SDSFP_WRAPPER(64, 128, 10)
        HIGHBD_SDSFP_WRAPPER(64, 64, 10)
        HIGHBD_SDSFP_WRAPPER(64, 32, 10)
        HIGHBD_SDSFP_WRAPPER(32, 64, 10)
        HIGHBD_SDSFP_WRAPPER(32, 32, 10)
        HIGHBD_SDSFP_WRAPPER(32, 16, 10)
        HIGHBD_SDSFP_WRAPPER(16, 32, 10)
        HIGHBD_SDSFP_WRAPPER(16, 16, 10)
        HIGHBD_SDSFP_WRAPPER(8, 16, 10)

#if !CONFIG_REALTIME_ONLY
        HIGHBD_SDSFP_WRAPPER(64, 16, 10)
        HIGHBD_SDSFP_WRAPPER(16, 64, 10)
        HIGHBD_SDSFP_WRAPPER(8, 32, 10)
        HIGHBD_SDSFP_WRAPPER(4, 16, 10)
#endif
        break;

      case AOM_BITS_12:
#if !CONFIG_REALTIME_ONLY
        HIGHBD_BFP_WRAPPER(64, 16, 12)
        HIGHBD_BFP_WRAPPER(16, 64, 12)
        HIGHBD_BFP_WRAPPER(32, 8, 12)
        HIGHBD_BFP_WRAPPER(8, 32, 12)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(16, 4, 12)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 16, 12)
#endif
        HIGHBD_BFP_WRAPPER(32, 16, 12)
        HIGHBD_BFP_WRAPPER(16, 32, 12)
        HIGHBD_BFP_WRAPPER(64, 32, 12)
        HIGHBD_BFP_WRAPPER(32, 64, 12)
        HIGHBD_BFP_WRAPPER(32, 32, 12)
        HIGHBD_BFP_WRAPPER(64, 64, 12)
        HIGHBD_BFP_WRAPPER(16, 16, 12)
        HIGHBD_BFP_WRAPPER(16, 8, 12)
        HIGHBD_BFP_WRAPPER(8, 16, 12)
        HIGHBD_BFP_WRAPPER(8, 8, 12)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(8, 4, 12)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 8, 12)
        HIGHBD_BFP_WRAPPER_NO_SAD_AVG(4, 4, 12)
        HIGHBD_BFP_WRAPPER(128, 128, 12)
        HIGHBD_BFP_WRAPPER(128, 64, 12)
        HIGHBD_BFP_WRAPPER(64, 128, 12)

        HIGHBD_MBFP_WRAPPER(128, 128, 12)
        HIGHBD_MBFP_WRAPPER(128, 64, 12)
        HIGHBD_MBFP_WRAPPER(64, 128, 12)
        HIGHBD_MBFP_WRAPPER(64, 64, 12)
        HIGHBD_MBFP_WRAPPER(64, 32, 12)
        HIGHBD_MBFP_WRAPPER(32, 64, 12)
        HIGHBD_MBFP_WRAPPER(32, 32, 12)
        HIGHBD_MBFP_WRAPPER(32, 16, 12)
        HIGHBD_MBFP_WRAPPER(16, 32, 12)
        HIGHBD_MBFP_WRAPPER(16, 16, 12)
        HIGHBD_MBFP_WRAPPER(8, 16, 12)
        HIGHBD_MBFP_WRAPPER(16, 8, 12)
        HIGHBD_MBFP_WRAPPER(8, 8, 12)
        HIGHBD_MBFP_WRAPPER(4, 8, 12)
        HIGHBD_MBFP_WRAPPER(8, 4, 12)
        HIGHBD_MBFP_WRAPPER(4, 4, 12)
#if !CONFIG_REALTIME_ONLY
        HIGHBD_MBFP_WRAPPER(64, 16, 12)
        HIGHBD_MBFP_WRAPPER(16, 64, 12)
        HIGHBD_MBFP_WRAPPER(32, 8, 12)
        HIGHBD_MBFP_WRAPPER(8, 32, 12)
        HIGHBD_MBFP_WRAPPER(16, 4, 12)
        HIGHBD_MBFP_WRAPPER(4, 16, 12)
#endif

// OBMC excluded from realtime only build.
#if !CONFIG_REALTIME_ONLY
        HIGHBD_OBFP_WRAPPER(128, 128, 12)
        HIGHBD_OBFP_WRAPPER(128, 64, 12)
        HIGHBD_OBFP_WRAPPER(64, 128, 12)
        HIGHBD_OBFP_WRAPPER(64, 64, 12)
        HIGHBD_OBFP_WRAPPER(64, 32, 12)
        HIGHBD_OBFP_WRAPPER(32, 64, 12)
        HIGHBD_OBFP_WRAPPER(32, 32, 12)
        HIGHBD_OBFP_WRAPPER(32, 16, 12)
        HIGHBD_OBFP_WRAPPER(16, 32, 12)
        HIGHBD_OBFP_WRAPPER(16, 16, 12)
        HIGHBD_OBFP_WRAPPER(8, 16, 12)
        HIGHBD_OBFP_WRAPPER(16, 8, 12)
        HIGHBD_OBFP_WRAPPER(8, 8, 12)
        HIGHBD_OBFP_WRAPPER(4, 8, 12)
        HIGHBD_OBFP_WRAPPER(8, 4, 12)
        HIGHBD_OBFP_WRAPPER(4, 4, 12)
        HIGHBD_OBFP_WRAPPER(64, 16, 12)
        HIGHBD_OBFP_WRAPPER(16, 64, 12)
        HIGHBD_OBFP_WRAPPER(32, 8, 12)
        HIGHBD_OBFP_WRAPPER(8, 32, 12)
        HIGHBD_OBFP_WRAPPER(16, 4, 12)
        HIGHBD_OBFP_WRAPPER(4, 16, 12)
#endif

        HIGHBD_SDSFP_WRAPPER(128, 128, 12)
        HIGHBD_SDSFP_WRAPPER(128, 64, 12)
        HIGHBD_SDSFP_WRAPPER(64, 128, 12)
        HIGHBD_SDSFP_WRAPPER(64, 64, 12)
        HIGHBD_SDSFP_WRAPPER(64, 32, 12)
        HIGHBD_SDSFP_WRAPPER(32, 64, 12)
        HIGHBD_SDSFP_WRAPPER(32, 32, 12)
        HIGHBD_SDSFP_WRAPPER(32, 16, 12)
        HIGHBD_SDSFP_WRAPPER(16, 32, 12)
        HIGHBD_SDSFP_WRAPPER(16, 16, 12)
        HIGHBD_SDSFP_WRAPPER(8, 16, 12)

#if !CONFIG_REALTIME_ONLY
        HIGHBD_SDSFP_WRAPPER(64, 16, 12)
        HIGHBD_SDSFP_WRAPPER(16, 64, 12)
        HIGHBD_SDSFP_WRAPPER(8, 32, 12)
        HIGHBD_SDSFP_WRAPPER(4, 16, 12)
#endif
        break;

      default:
        assert(0 &&
               "cm->seq_params->bit_depth should be AOM_BITS_8, "
               "AOM_BITS_10 or AOM_BITS_12");
    }
  }
}